

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersector1<4>::
     intersect_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  int iVar79;
  float fVar80;
  undefined4 uVar81;
  float fVar85;
  float fVar86;
  vint4 bi_2;
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi_1;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  vint4 bi;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vint4 ai_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  vint4 ai;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 ai_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  float fVar158;
  vfloat4 a0_3;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  __m128 a_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  __m128 a;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar188;
  float fVar189;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar190;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar203;
  float fVar204;
  vfloat4 a0_1;
  float fVar205;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar206;
  float fVar213;
  float fVar214;
  vfloat4 a0;
  undefined1 auVar207 [16];
  float fVar215;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_358;
  float local_354;
  ulong local_350;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  long local_320;
  Primitive *local_318;
  ulong local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  RayQueryContext *local_2b0;
  RTCFilterFunctionNArguments local_2a8;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint auStack_158 [4];
  undefined8 local_148;
  float local_140;
  undefined8 local_13c;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  uint uStack_b8;
  float afStack_b4 [7];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar22;
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  
  PVar4 = prim[1];
  uVar22 = (ulong)(byte)PVar4;
  fVar193 = *(float *)(prim + uVar22 * 0x19 + 0x12);
  auVar28 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar22 * 0x19 + 6));
  auVar107._0_4_ = fVar193 * auVar28._0_4_;
  auVar107._4_4_ = fVar193 * auVar28._4_4_;
  auVar107._8_4_ = fVar193 * auVar28._8_4_;
  auVar107._12_4_ = fVar193 * auVar28._12_4_;
  auVar41._0_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar41._4_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar41._8_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar41._12_4_ = fVar193 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 4 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 5 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 6 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 * 0xb + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar22 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  uVar24 = (ulong)(uint)((int)(uVar22 * 9) * 2);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 + uVar22 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar34);
  uVar21 = (ulong)(uint)((int)(uVar22 * 5) << 2);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar216._4_4_ = auVar41._0_4_;
  auVar216._0_4_ = auVar41._0_4_;
  auVar216._8_4_ = auVar41._0_4_;
  auVar216._12_4_ = auVar41._0_4_;
  auVar36 = vshufps_avx(auVar41,auVar41,0x55);
  auVar31 = vshufps_avx(auVar41,auVar41,0xaa);
  fVar193 = auVar31._0_4_;
  auVar44._0_4_ = fVar193 * auVar30._0_4_;
  fVar177 = auVar31._4_4_;
  auVar44._4_4_ = fVar177 * auVar30._4_4_;
  fVar188 = auVar31._8_4_;
  auVar44._8_4_ = fVar188 * auVar30._8_4_;
  fVar189 = auVar31._12_4_;
  auVar44._12_4_ = fVar189 * auVar30._12_4_;
  auVar88._0_4_ = auVar33._0_4_ * fVar193;
  auVar88._4_4_ = auVar33._4_4_ * fVar177;
  auVar88._8_4_ = auVar33._8_4_ * fVar188;
  auVar88._12_4_ = auVar33._12_4_ * fVar189;
  auVar42._0_4_ = auVar35._0_4_ * fVar193;
  auVar42._4_4_ = auVar35._4_4_ * fVar177;
  auVar42._8_4_ = auVar35._8_4_ * fVar188;
  auVar42._12_4_ = auVar35._12_4_ * fVar189;
  auVar31 = vfmadd231ps_fma(auVar44,auVar36,auVar29);
  auVar38 = vfmadd231ps_fma(auVar88,auVar36,auVar37);
  auVar36 = vfmadd231ps_fma(auVar42,auVar34,auVar36);
  auVar39 = vfmadd231ps_fma(auVar31,auVar216,auVar28);
  auVar38 = vfmadd231ps_fma(auVar38,auVar216,auVar40);
  auVar41 = vfmadd231ps_fma(auVar36,auVar32,auVar216);
  auVar217._4_4_ = auVar107._0_4_;
  auVar217._0_4_ = auVar107._0_4_;
  auVar217._8_4_ = auVar107._0_4_;
  auVar217._12_4_ = auVar107._0_4_;
  auVar36 = vshufps_avx(auVar107,auVar107,0x55);
  auVar31 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar193 = auVar31._0_4_;
  auVar228._0_4_ = fVar193 * auVar30._0_4_;
  fVar177 = auVar31._4_4_;
  auVar228._4_4_ = fVar177 * auVar30._4_4_;
  fVar188 = auVar31._8_4_;
  auVar228._8_4_ = fVar188 * auVar30._8_4_;
  fVar189 = auVar31._12_4_;
  auVar228._12_4_ = fVar189 * auVar30._12_4_;
  auVar118._0_4_ = auVar33._0_4_ * fVar193;
  auVar118._4_4_ = auVar33._4_4_ * fVar177;
  auVar118._8_4_ = auVar33._8_4_ * fVar188;
  auVar118._12_4_ = auVar33._12_4_ * fVar189;
  auVar108._0_4_ = auVar35._0_4_ * fVar193;
  auVar108._4_4_ = auVar35._4_4_ * fVar177;
  auVar108._8_4_ = auVar35._8_4_ * fVar188;
  auVar108._12_4_ = auVar35._12_4_ * fVar189;
  auVar29 = vfmadd231ps_fma(auVar228,auVar36,auVar29);
  auVar30 = vfmadd231ps_fma(auVar118,auVar36,auVar37);
  auVar37 = vfmadd231ps_fma(auVar108,auVar36,auVar34);
  auVar33 = vfmadd231ps_fma(auVar29,auVar217,auVar28);
  auVar34 = vfmadd231ps_fma(auVar30,auVar217,auVar40);
  auVar64._16_16_ = in_YmmResult._16_16_;
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar232 = ZEXT1664(auVar28);
  auVar35 = vfmadd231ps_fma(auVar37,auVar217,auVar32);
  auVar29 = vandps_avx512vl(auVar39,auVar28);
  auVar137._8_4_ = 0x219392ef;
  auVar137._0_8_ = 0x219392ef219392ef;
  auVar137._12_4_ = 0x219392ef;
  uVar24 = vcmpps_avx512vl(auVar29,auVar137,1);
  bVar10 = (bool)((byte)uVar24 & 1);
  auVar31._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._0_4_;
  bVar10 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar31._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._4_4_;
  bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar31._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._8_4_;
  bVar10 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar31._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar39._12_4_;
  auVar29 = vandps_avx512vl(auVar38,auVar28);
  uVar24 = vcmpps_avx512vl(auVar29,auVar137,1);
  bVar10 = (bool)((byte)uVar24 & 1);
  auVar39._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar38._0_4_;
  bVar10 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar38._4_4_;
  bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar38._8_4_;
  bVar10 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar38._12_4_;
  auVar28 = vandps_avx512vl(auVar41,auVar28);
  uVar24 = vcmpps_avx512vl(auVar28,auVar137,1);
  bVar10 = (bool)((byte)uVar24 & 1);
  auVar38._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._0_4_;
  bVar10 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._4_4_;
  bVar10 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._8_4_;
  bVar10 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar41._12_4_;
  auVar28 = vrcp14ps_avx512vl(auVar31);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar233 = ZEXT1664(auVar29);
  auVar30 = vfnmadd213ps_avx512vl(auVar31,auVar28,auVar29);
  auVar40 = vfmadd132ps_fma(auVar30,auVar28,auVar28);
  auVar28 = vrcp14ps_avx512vl(auVar39);
  auVar30 = vfnmadd213ps_avx512vl(auVar39,auVar28,auVar29);
  auVar37 = vfmadd132ps_fma(auVar30,auVar28,auVar28);
  auVar28 = vrcp14ps_avx512vl(auVar38);
  auVar29 = vfnmadd213ps_avx512vl(auVar38,auVar28,auVar29);
  auVar32 = vfmadd132ps_fma(auVar29,auVar28,auVar28);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar22 * 7 + 6);
  auVar28 = vpmovsxwd_avx(auVar28);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar28 = vsubps_avx(auVar28,auVar33);
  auVar127._0_4_ = auVar40._0_4_ * auVar28._0_4_;
  auVar127._4_4_ = auVar40._4_4_ * auVar28._4_4_;
  auVar127._8_4_ = auVar40._8_4_ * auVar28._8_4_;
  auVar127._12_4_ = auVar40._12_4_ * auVar28._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar22 * 9 + 6);
  auVar28 = vpmovsxwd_avx(auVar29);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar28 = vsubps_avx(auVar28,auVar33);
  auVar31 = vpbroadcastd_avx512vl();
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar29 = vpmovsxwd_avx(auVar30);
  auVar45._0_4_ = auVar40._0_4_ * auVar28._0_4_;
  auVar45._4_4_ = auVar40._4_4_ * auVar28._4_4_;
  auVar45._8_4_ = auVar40._8_4_ * auVar28._8_4_;
  auVar45._12_4_ = auVar40._12_4_ * auVar28._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar22 * -2 + 6);
  auVar28 = vpmovsxwd_avx(auVar40);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar28 = vsubps_avx(auVar28,auVar34);
  auVar138._0_4_ = auVar37._0_4_ * auVar28._0_4_;
  auVar138._4_4_ = auVar37._4_4_ * auVar28._4_4_;
  auVar138._8_4_ = auVar37._8_4_ * auVar28._8_4_;
  auVar138._12_4_ = auVar37._12_4_ * auVar28._12_4_;
  auVar28 = vcvtdq2ps_avx(auVar29);
  auVar28 = vsubps_avx(auVar28,auVar34);
  auVar43._0_4_ = auVar37._0_4_ * auVar28._0_4_;
  auVar43._4_4_ = auVar37._4_4_ * auVar28._4_4_;
  auVar43._8_4_ = auVar37._8_4_ * auVar28._8_4_;
  auVar43._12_4_ = auVar37._12_4_ * auVar28._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar21 + uVar22 + 6);
  auVar28 = vpmovsxwd_avx(auVar37);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar28 = vsubps_avx(auVar28,auVar35);
  auVar119._0_4_ = auVar32._0_4_ * auVar28._0_4_;
  auVar119._4_4_ = auVar32._4_4_ * auVar28._4_4_;
  auVar119._8_4_ = auVar32._8_4_ * auVar28._8_4_;
  auVar119._12_4_ = auVar32._12_4_ * auVar28._12_4_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar22 * 0x17 + 6);
  auVar28 = vpmovsxwd_avx(auVar33);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar28 = vsubps_avx(auVar28,auVar35);
  auVar46._0_4_ = auVar32._0_4_ * auVar28._0_4_;
  auVar46._4_4_ = auVar32._4_4_ * auVar28._4_4_;
  auVar46._8_4_ = auVar32._8_4_ * auVar28._8_4_;
  auVar46._12_4_ = auVar32._12_4_ * auVar28._12_4_;
  auVar28 = vpminsd_avx(auVar127,auVar45);
  auVar29 = vpminsd_avx(auVar138,auVar43);
  auVar28 = vmaxps_avx(auVar28,auVar29);
  auVar29 = vpminsd_avx(auVar119,auVar46);
  uVar81 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar32._4_4_ = uVar81;
  auVar32._0_4_ = uVar81;
  auVar32._8_4_ = uVar81;
  auVar32._12_4_ = uVar81;
  auVar29 = vmaxps_avx512vl(auVar29,auVar32);
  auVar28 = vmaxps_avx(auVar28,auVar29);
  auVar34._8_4_ = 0x3f7ffffa;
  auVar34._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar34._12_4_ = 0x3f7ffffa;
  local_118 = vmulps_avx512vl(auVar28,auVar34);
  auVar28 = vpmaxsd_avx(auVar127,auVar45);
  auVar29 = vpmaxsd_avx(auVar138,auVar43);
  auVar28 = vminps_avx(auVar28,auVar29);
  auVar29 = vpmaxsd_avx(auVar119,auVar46);
  fVar193 = (ray->super_RayK<1>).tfar;
  auVar35._4_4_ = fVar193;
  auVar35._0_4_ = fVar193;
  auVar35._8_4_ = fVar193;
  auVar35._12_4_ = fVar193;
  auVar29 = vminps_avx512vl(auVar29,auVar35);
  auVar28 = vminps_avx(auVar28,auVar29);
  auVar36._8_4_ = 0x3f800003;
  auVar36._0_8_ = 0x3f8000033f800003;
  auVar36._12_4_ = 0x3f800003;
  auVar28 = vmulps_avx512vl(auVar28,auVar36);
  uVar12 = vcmpps_avx512vl(local_118,auVar28,2);
  local_350 = vpcmpgtd_avx512vl(auVar31,_DAT_01ff0cf0);
  local_350 = ((byte)uVar12 & 0xf) & local_350;
  if ((char)local_350 == '\0') {
    return;
  }
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar236 = ZEXT1664(auVar28);
  local_318 = prim;
LAB_01b36f10:
  lVar25 = 0;
  for (uVar24 = local_350; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar27 = *(uint *)(local_318 + 2);
  pGVar6 = (context->scene->geometries).items[uVar27].ptr;
  local_310 = (ulong)*(uint *)(local_318 + lVar25 * 4 + 6);
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(local_318 + lVar25 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar28 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar24);
  lVar25 = uVar24 + 1;
  auVar29 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar25);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar30 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar24);
  auVar40 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar25);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar33 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar24),
                       auVar28,auVar32);
  auVar34 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar25),
                       auVar29,auVar32);
  auVar35 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar24 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar30,auVar32);
  auVar36 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar25),
                       auVar40,auVar32);
  auVar61._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar37 = vmulps_avx512vl(auVar29,auVar61._0_16_);
  auVar31 = vfmadd231ps_avx512vl(auVar37,auVar34,auVar61._0_16_);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar33,auVar31);
  auVar89._0_4_ = auVar28._0_4_ + auVar37._0_4_;
  auVar89._4_4_ = auVar28._4_4_ + auVar37._4_4_;
  auVar89._8_4_ = auVar28._8_4_ + auVar37._8_4_;
  auVar89._12_4_ = auVar28._12_4_ + auVar37._12_4_;
  auVar41 = auVar236._0_16_;
  auVar37 = vfmadd231ps_avx512vl(auVar31,auVar33,auVar41);
  auVar31 = vfnmadd231ps_avx512vl(auVar37,auVar28,auVar41);
  auVar37 = vmulps_avx512vl(auVar40,auVar61._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar37,auVar36,auVar61._0_16_);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar35,auVar38);
  auVar207._0_4_ = auVar30._0_4_ + auVar37._0_4_;
  auVar207._4_4_ = auVar30._4_4_ + auVar37._4_4_;
  auVar207._8_4_ = auVar30._8_4_ + auVar37._8_4_;
  auVar207._12_4_ = auVar30._12_4_ + auVar37._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar38,auVar35,auVar41);
  auVar38 = vfnmadd231ps_avx512vl(auVar37,auVar30,auVar41);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar34,auVar29);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar33,auVar61._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar37,auVar28,auVar61._0_16_);
  auVar29 = vmulps_avx512vl(auVar29,auVar41);
  auVar29 = vfnmadd231ps_avx512vl(auVar29,auVar41,auVar34);
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar61._0_16_,auVar33);
  auVar34 = vfnmadd231ps_avx512vl(auVar29,auVar61._0_16_,auVar28);
  auVar28 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar36,auVar40);
  auVar28 = vfmadd231ps_avx512vl(auVar28,auVar35,auVar61._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar28,auVar30,auVar61._0_16_);
  auVar28 = vmulps_avx512vl(auVar40,auVar41);
  auVar28 = vfnmadd231ps_avx512vl(auVar28,auVar41,auVar36);
  auVar28 = vfmadd231ps_avx512vl(auVar28,auVar61._0_16_,auVar35);
  auVar33 = vfnmadd231ps_avx512vl(auVar28,auVar61._0_16_,auVar30);
  auVar28 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar29 = vshufps_avx(auVar207,auVar207,0xc9);
  fVar80 = auVar31._0_4_;
  auVar139._0_4_ = fVar80 * auVar29._0_4_;
  fVar85 = auVar31._4_4_;
  auVar139._4_4_ = fVar85 * auVar29._4_4_;
  fVar86 = auVar31._8_4_;
  auVar139._8_4_ = fVar86 * auVar29._8_4_;
  fVar87 = auVar31._12_4_;
  auVar139._12_4_ = fVar87 * auVar29._12_4_;
  auVar29 = vfmsub231ps_fma(auVar139,auVar28,auVar207);
  auVar30 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar29 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar159._0_4_ = auVar29._0_4_ * fVar80;
  auVar159._4_4_ = auVar29._4_4_ * fVar85;
  auVar159._8_4_ = auVar29._8_4_ * fVar86;
  auVar159._12_4_ = auVar29._12_4_ * fVar87;
  auVar28 = vfmsub231ps_fma(auVar159,auVar28,auVar38);
  auVar40 = vshufps_avx(auVar28,auVar28,0xc9);
  auVar28 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar29 = vshufps_avx(auVar37,auVar37,0xc9);
  fVar193 = auVar34._0_4_;
  auVar169._0_4_ = auVar29._0_4_ * fVar193;
  fVar177 = auVar34._4_4_;
  auVar169._4_4_ = auVar29._4_4_ * fVar177;
  fVar188 = auVar34._8_4_;
  auVar169._8_4_ = auVar29._8_4_ * fVar188;
  fVar189 = auVar34._12_4_;
  auVar169._12_4_ = auVar29._12_4_ * fVar189;
  auVar29 = vfmsub231ps_fma(auVar169,auVar28,auVar37);
  auVar37 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar29 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar170._0_4_ = auVar29._0_4_ * fVar193;
  auVar170._4_4_ = auVar29._4_4_ * fVar177;
  auVar170._8_4_ = auVar29._8_4_ * fVar188;
  auVar170._12_4_ = auVar29._12_4_ * fVar189;
  auVar28 = vfmsub231ps_fma(auVar170,auVar28,auVar33);
  auVar33 = vshufps_avx(auVar28,auVar28,0xc9);
  auVar28 = vdpps_avx(auVar30,auVar30,0x7f);
  fVar190 = auVar28._0_4_;
  auVar61._16_16_ = auVar64._16_16_;
  auVar47._4_28_ = auVar61._4_28_;
  auVar47._0_4_ = fVar190;
  auVar29 = vrsqrt14ss_avx512f(auVar61._0_16_,auVar47._0_16_);
  auVar35 = vmulss_avx512f(auVar29,ZEXT416(0x3fc00000));
  fVar191 = auVar29._0_4_;
  fVar192 = auVar35._0_4_ - fVar190 * 0.5 * fVar191 * fVar191 * fVar191;
  auVar29 = vdpps_avx(auVar30,auVar40,0x7f);
  fVar206 = fVar192 * auVar30._0_4_;
  fVar213 = fVar192 * auVar30._4_4_;
  fVar214 = fVar192 * auVar30._8_4_;
  fVar215 = fVar192 * auVar30._12_4_;
  auVar160._0_4_ = fVar190 * auVar40._0_4_;
  auVar160._4_4_ = fVar190 * auVar40._4_4_;
  auVar160._8_4_ = fVar190 * auVar40._8_4_;
  auVar160._12_4_ = fVar190 * auVar40._12_4_;
  fVar190 = auVar29._0_4_;
  auVar140._0_4_ = fVar190 * auVar30._0_4_;
  auVar140._4_4_ = fVar190 * auVar30._4_4_;
  auVar140._8_4_ = fVar190 * auVar30._8_4_;
  auVar140._12_4_ = fVar190 * auVar30._12_4_;
  auVar30 = vsubps_avx(auVar160,auVar140);
  auVar29 = vrcp14ss_avx512f(auVar61._0_16_,auVar47._0_16_);
  auVar28 = vfnmadd213ss_fma(auVar28,auVar29,SUB6416(ZEXT464(0x40000000),0));
  fVar190 = auVar29._0_4_ * auVar28._0_4_;
  auVar28 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar191 = auVar28._0_4_;
  auVar62._16_16_ = auVar64._16_16_;
  auVar62._0_16_ = auVar61._0_16_;
  auVar63._4_28_ = auVar62._4_28_;
  auVar63._0_4_ = fVar191;
  auVar29 = vrsqrt14ss_avx512f(auVar61._0_16_,auVar63._0_16_);
  auVar40 = vmulss_avx512f(auVar29,ZEXT416(0x3fc00000));
  fVar158 = auVar29._0_4_;
  fVar158 = auVar40._0_4_ - fVar191 * 0.5 * fVar158 * fVar158 * fVar158;
  auVar29 = vdpps_avx(auVar37,auVar33,0x7f);
  fVar194 = fVar158 * auVar37._0_4_;
  fVar203 = fVar158 * auVar37._4_4_;
  fVar204 = fVar158 * auVar37._8_4_;
  fVar205 = fVar158 * auVar37._12_4_;
  auVar128._0_4_ = fVar191 * auVar33._0_4_;
  auVar128._4_4_ = fVar191 * auVar33._4_4_;
  auVar128._8_4_ = fVar191 * auVar33._8_4_;
  auVar128._12_4_ = fVar191 * auVar33._12_4_;
  fVar191 = auVar29._0_4_;
  auVar120._0_4_ = fVar191 * auVar37._0_4_;
  auVar120._4_4_ = fVar191 * auVar37._4_4_;
  auVar120._8_4_ = fVar191 * auVar37._8_4_;
  auVar120._12_4_ = fVar191 * auVar37._12_4_;
  auVar40 = vsubps_avx(auVar128,auVar120);
  auVar29 = vrcp14ss_avx512f(auVar61._0_16_,auVar63._0_16_);
  auVar28 = vfnmadd213ss_fma(auVar28,auVar29,SUB6416(ZEXT464(0x40000000),0));
  fVar191 = auVar29._0_4_ * auVar28._0_4_;
  auVar28 = vshufps_avx(auVar89,auVar89,0xff);
  auVar147._0_4_ = fVar206 * auVar28._0_4_;
  auVar147._4_4_ = fVar213 * auVar28._4_4_;
  auVar147._8_4_ = fVar214 * auVar28._8_4_;
  auVar147._12_4_ = fVar215 * auVar28._12_4_;
  local_208 = vsubps_avx(auVar89,auVar147);
  auVar29 = vshufps_avx(auVar31,auVar31,0xff);
  auVar129._0_4_ = auVar29._0_4_ * fVar206 + auVar28._0_4_ * fVar192 * fVar190 * auVar30._0_4_;
  auVar129._4_4_ = auVar29._4_4_ * fVar213 + auVar28._4_4_ * fVar192 * fVar190 * auVar30._4_4_;
  auVar129._8_4_ = auVar29._8_4_ * fVar214 + auVar28._8_4_ * fVar192 * fVar190 * auVar30._8_4_;
  auVar129._12_4_ = auVar29._12_4_ * fVar215 + auVar28._12_4_ * fVar192 * fVar190 * auVar30._12_4_;
  auVar30 = vsubps_avx(auVar31,auVar129);
  local_218._0_4_ = auVar89._0_4_ + auVar147._0_4_;
  local_218._4_4_ = auVar89._4_4_ + auVar147._4_4_;
  fStack_210 = auVar89._8_4_ + auVar147._8_4_;
  fStack_20c = auVar89._12_4_ + auVar147._12_4_;
  auVar82._0_4_ = fVar80 + auVar129._0_4_;
  auVar82._4_4_ = fVar85 + auVar129._4_4_;
  auVar82._8_4_ = fVar86 + auVar129._8_4_;
  auVar82._12_4_ = fVar87 + auVar129._12_4_;
  auVar28 = vshufps_avx(auVar39,auVar39,0xff);
  auVar130._0_4_ = fVar194 * auVar28._0_4_;
  auVar130._4_4_ = fVar203 * auVar28._4_4_;
  auVar130._8_4_ = fVar204 * auVar28._8_4_;
  auVar130._12_4_ = fVar205 * auVar28._12_4_;
  local_228 = vsubps_avx(auVar39,auVar130);
  auVar29 = vshufps_avx(auVar34,auVar34,0xff);
  auVar90._0_4_ = fVar194 * auVar29._0_4_ + auVar28._0_4_ * fVar158 * auVar40._0_4_ * fVar191;
  auVar90._4_4_ = fVar203 * auVar29._4_4_ + auVar28._4_4_ * fVar158 * auVar40._4_4_ * fVar191;
  auVar90._8_4_ = fVar204 * auVar29._8_4_ + auVar28._8_4_ * fVar158 * auVar40._8_4_ * fVar191;
  auVar90._12_4_ = fVar205 * auVar29._12_4_ + auVar28._12_4_ * fVar158 * auVar40._12_4_ * fVar191;
  auVar28 = vsubps_avx(auVar34,auVar90);
  _local_238 = vaddps_avx512vl(auVar39,auVar130);
  auVar91._0_4_ = fVar193 + auVar90._0_4_;
  auVar91._4_4_ = fVar177 + auVar90._4_4_;
  auVar91._8_4_ = fVar188 + auVar90._8_4_;
  auVar91._12_4_ = fVar189 + auVar90._12_4_;
  auVar29 = vmulps_avx512vl(auVar30,auVar32);
  local_248 = vaddps_avx512vl(local_208,auVar29);
  auVar28 = vmulps_avx512vl(auVar28,auVar32);
  local_258 = vsubps_avx512vl(local_228,auVar28);
  auVar28 = vmulps_avx512vl(auVar82,auVar32);
  _local_268 = vaddps_avx512vl(_local_218,auVar28);
  auVar28 = vmulps_avx512vl(auVar91,auVar32);
  _local_278 = vsubps_avx512vl(_local_238,auVar28);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar29 = vsubps_avx(local_208,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar92._4_4_ = uVar81;
  auVar92._0_4_ = uVar81;
  auVar92._8_4_ = uVar81;
  auVar92._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  fVar193 = (pre->ray_space).vz.field_0.m128[0];
  fVar177 = (pre->ray_space).vz.field_0.m128[1];
  fVar188 = (pre->ray_space).vz.field_0.m128[2];
  fVar189 = (pre->ray_space).vz.field_0.m128[3];
  auVar83._0_4_ = fVar193 * auVar29._0_4_;
  auVar83._4_4_ = fVar177 * auVar29._4_4_;
  auVar83._8_4_ = fVar188 * auVar29._8_4_;
  auVar83._12_4_ = fVar189 * auVar29._12_4_;
  auVar28 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar3,auVar28);
  auVar37 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar92);
  auVar29 = vsubps_avx512vl(local_248,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar101._4_4_ = uVar81;
  auVar101._0_4_ = uVar81;
  auVar101._8_4_ = uVar81;
  auVar101._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar93._0_4_ = fVar193 * auVar29._0_4_;
  auVar93._4_4_ = fVar177 * auVar29._4_4_;
  auVar93._8_4_ = fVar188 * auVar29._8_4_;
  auVar93._12_4_ = fVar189 * auVar29._12_4_;
  auVar28 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar3,auVar28);
  auVar33 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar101);
  auVar29 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar141._4_4_ = uVar81;
  auVar141._0_4_ = uVar81;
  auVar141._8_4_ = uVar81;
  auVar141._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar102._0_4_ = fVar193 * auVar29._0_4_;
  auVar102._4_4_ = fVar177 * auVar29._4_4_;
  auVar102._8_4_ = fVar188 * auVar29._8_4_;
  auVar102._12_4_ = fVar189 * auVar29._12_4_;
  auVar28 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar3,auVar28);
  auVar32 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar141);
  auVar29 = vsubps_avx(local_228,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar161._4_4_ = uVar81;
  auVar161._0_4_ = uVar81;
  auVar161._8_4_ = uVar81;
  auVar161._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar142._0_4_ = fVar193 * auVar29._0_4_;
  auVar142._4_4_ = fVar177 * auVar29._4_4_;
  auVar142._8_4_ = fVar188 * auVar29._8_4_;
  auVar142._12_4_ = fVar189 * auVar29._12_4_;
  auVar28 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar3,auVar28);
  auVar34 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar161);
  auVar29 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar171._4_4_ = uVar81;
  auVar171._0_4_ = uVar81;
  auVar171._8_4_ = uVar81;
  auVar171._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar162._0_4_ = auVar29._0_4_ * fVar193;
  auVar162._4_4_ = auVar29._4_4_ * fVar177;
  auVar162._8_4_ = auVar29._8_4_ * fVar188;
  auVar162._12_4_ = auVar29._12_4_ * fVar189;
  auVar28 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar3,auVar28);
  auVar35 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar171);
  auVar29 = vsubps_avx512vl(_local_268,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar178._4_4_ = uVar81;
  auVar178._0_4_ = uVar81;
  auVar178._8_4_ = uVar81;
  auVar178._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar172._0_4_ = auVar29._0_4_ * fVar193;
  auVar172._4_4_ = auVar29._4_4_ * fVar177;
  auVar172._8_4_ = auVar29._8_4_ * fVar188;
  auVar172._12_4_ = auVar29._12_4_ * fVar189;
  auVar28 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar3,auVar28);
  auVar36 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar178);
  auVar29 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar195._4_4_ = uVar81;
  auVar195._0_4_ = uVar81;
  auVar195._8_4_ = uVar81;
  auVar195._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar179._0_4_ = auVar29._0_4_ * fVar193;
  auVar179._4_4_ = auVar29._4_4_ * fVar177;
  auVar179._8_4_ = auVar29._8_4_ * fVar188;
  auVar179._12_4_ = auVar29._12_4_ * fVar189;
  auVar28 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar3,auVar28);
  auVar31 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar195);
  auVar29 = vsubps_avx512vl(_local_238,(undefined1  [16])aVar1);
  uVar81 = auVar29._0_4_;
  auVar196._4_4_ = uVar81;
  auVar196._0_4_ = uVar81;
  auVar196._8_4_ = uVar81;
  auVar196._12_4_ = uVar81;
  auVar28 = vshufps_avx(auVar29,auVar29,0x55);
  auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
  auVar121._0_4_ = fVar193 * auVar29._0_4_;
  auVar121._4_4_ = fVar177 * auVar29._4_4_;
  auVar121._8_4_ = fVar188 * auVar29._8_4_;
  auVar121._12_4_ = fVar189 * auVar29._12_4_;
  auVar28 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar3,auVar28);
  auVar38 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar2,auVar196);
  local_348 = vmovlhps_avx512f(auVar37,auVar35);
  auVar234 = ZEXT1664(local_348);
  local_2c8 = vmovlhps_avx(auVar33,auVar36);
  local_2d8 = vmovlhps_avx512f(auVar32,auVar31);
  _local_1e8 = vmovlhps_avx512f(auVar34,auVar38);
  auVar28 = vminps_avx512vl(local_348,local_2c8);
  auVar30 = vmaxps_avx512vl(local_348,local_2c8);
  auVar29 = vminps_avx512vl(local_2d8,_local_1e8);
  auVar29 = vminps_avx(auVar28,auVar29);
  auVar28 = vmaxps_avx512vl(local_2d8,_local_1e8);
  auVar28 = vmaxps_avx(auVar30,auVar28);
  auVar30 = vshufpd_avx(auVar29,auVar29,3);
  auVar40 = vshufpd_avx(auVar28,auVar28,3);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar28 = vmaxps_avx(auVar28,auVar40);
  auVar29 = vandps_avx512vl(auVar29,auVar232._0_16_);
  auVar28 = vandps_avx512vl(auVar28,auVar232._0_16_);
  auVar28 = vmaxps_avx(auVar29,auVar28);
  auVar29 = vmovshdup_avx(auVar28);
  auVar28 = vmaxss_avx(auVar29,auVar28);
  local_320 = local_350 + 0xf;
  local_168._8_8_ = auVar37._0_8_;
  local_168._0_8_ = auVar37._0_8_;
  local_178._8_8_ = auVar33._0_8_;
  local_178._0_8_ = auVar33._0_8_;
  local_188 = vmovddup_avx512vl(auVar32);
  local_198._0_8_ = auVar34._0_8_;
  local_198._8_8_ = local_198._0_8_;
  register0x00001348 = auVar35._0_8_;
  local_1a8 = auVar35._0_8_;
  register0x00001408 = auVar36._0_8_;
  local_1b8 = auVar36._0_8_;
  register0x00001448 = auVar31._0_8_;
  local_1c8 = auVar31._0_8_;
  register0x00001488 = auVar38._0_8_;
  local_1d8 = auVar38._0_8_;
  local_1f8 = ZEXT416((uint)(auVar28._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_1f8);
  auVar14._8_4_ = 0x80000000;
  auVar14._0_8_ = 0x8000000080000000;
  auVar14._12_4_ = 0x80000000;
  auVar28 = vxorps_avx512vl(local_78._0_16_,auVar14);
  local_98 = vbroadcastss_avx512vl(auVar28);
  local_2f8 = vsubps_avx512vl(local_2c8,local_348);
  local_308 = vsubps_avx512vl(local_2d8,local_2c8);
  local_c8 = vsubps_avx512vl(_local_1e8,local_2d8);
  local_d8 = vsubps_avx(_local_218,local_208);
  local_e8 = vsubps_avx512vl(_local_268,local_248);
  local_f8 = vsubps_avx512vl(_local_278,local_258);
  _local_108 = vsubps_avx512vl(_local_238,local_228);
  uVar24 = 0;
  auVar28 = ZEXT816(0x3f80000000000000);
  auVar227 = ZEXT1664(auVar28);
  do {
    local_2e8 = auVar227._0_16_;
    auVar29 = vshufps_avx(local_2e8,local_2e8,0x50);
    auVar218._8_4_ = 0x3f800000;
    auVar218._0_8_ = &DAT_3f8000003f800000;
    auVar218._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._0_16_ = auVar218;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar30 = vsubps_avx(auVar218,auVar29);
    fVar193 = auVar29._0_4_;
    auVar109._0_4_ = local_1a8._0_4_ * fVar193;
    fVar177 = auVar29._4_4_;
    auVar109._4_4_ = local_1a8._4_4_ * fVar177;
    fVar188 = auVar29._8_4_;
    auVar109._8_4_ = local_1a8._8_4_ * fVar188;
    fVar189 = auVar29._12_4_;
    auVar109._12_4_ = local_1a8._12_4_ * fVar189;
    auVar122._0_4_ = local_1b8._0_4_ * fVar193;
    auVar122._4_4_ = local_1b8._4_4_ * fVar177;
    auVar122._8_4_ = local_1b8._8_4_ * fVar188;
    auVar122._12_4_ = local_1b8._12_4_ * fVar189;
    auVar131._0_4_ = local_1c8._0_4_ * fVar193;
    auVar131._4_4_ = local_1c8._4_4_ * fVar177;
    auVar131._8_4_ = local_1c8._8_4_ * fVar188;
    auVar131._12_4_ = local_1c8._12_4_ * fVar189;
    auVar94._0_4_ = local_1d8._0_4_ * fVar193;
    auVar94._4_4_ = local_1d8._4_4_ * fVar177;
    auVar94._8_4_ = local_1d8._8_4_ * fVar188;
    auVar94._12_4_ = local_1d8._12_4_ * fVar189;
    auVar40 = vfmadd231ps_fma(auVar109,auVar30,local_168);
    auVar37 = vfmadd231ps_fma(auVar122,auVar30,local_178);
    auVar33 = vfmadd231ps_avx512vl(auVar131,auVar30,local_188);
    auVar30 = vfmadd231ps_fma(auVar94,local_198,auVar30);
    auVar29 = vmovshdup_avx(auVar28);
    fVar177 = auVar28._0_4_;
    fVar193 = (auVar29._0_4_ - fVar177) * 0.04761905;
    auVar60._4_4_ = fVar177;
    auVar60._0_4_ = fVar177;
    auVar60._8_4_ = fVar177;
    auVar60._12_4_ = fVar177;
    auVar60._16_4_ = fVar177;
    auVar60._20_4_ = fVar177;
    auVar60._24_4_ = fVar177;
    auVar60._28_4_ = fVar177;
    auVar55._0_8_ = auVar29._0_8_;
    auVar55._8_8_ = auVar55._0_8_;
    auVar55._16_8_ = auVar55._0_8_;
    auVar55._24_8_ = auVar55._0_8_;
    auVar64 = vsubps_avx(auVar55,auVar60);
    uVar81 = auVar40._0_4_;
    auVar66._4_4_ = uVar81;
    auVar66._0_4_ = uVar81;
    auVar66._8_4_ = uVar81;
    auVar66._12_4_ = uVar81;
    auVar66._16_4_ = uVar81;
    auVar66._20_4_ = uVar81;
    auVar66._24_4_ = uVar81;
    auVar66._28_4_ = uVar81;
    auVar56._8_4_ = 1;
    auVar56._0_8_ = 0x100000001;
    auVar56._12_4_ = 1;
    auVar56._16_4_ = 1;
    auVar56._20_4_ = 1;
    auVar56._24_4_ = 1;
    auVar56._28_4_ = 1;
    auVar62 = ZEXT1632(auVar40);
    auVar61 = vpermps_avx2(auVar56,auVar62);
    auVar47 = vbroadcastss_avx512vl(auVar37);
    auVar63 = ZEXT1632(auVar37);
    auVar48 = vpermps_avx512vl(auVar56,auVar63);
    auVar49 = vbroadcastss_avx512vl(auVar33);
    auVar57 = ZEXT1632(auVar33);
    auVar50 = vpermps_avx512vl(auVar56,auVar57);
    auVar51 = vbroadcastss_avx512vl(auVar30);
    auVar59 = ZEXT1632(auVar30);
    auVar52 = vpermps_avx512vl(auVar56,auVar59);
    auVar67._4_4_ = fVar193;
    auVar67._0_4_ = fVar193;
    auVar67._8_4_ = fVar193;
    auVar67._12_4_ = fVar193;
    auVar67._16_4_ = fVar193;
    auVar67._20_4_ = fVar193;
    auVar67._24_4_ = fVar193;
    auVar67._28_4_ = fVar193;
    auVar58._8_4_ = 2;
    auVar58._0_8_ = 0x200000002;
    auVar58._12_4_ = 2;
    auVar58._16_4_ = 2;
    auVar58._20_4_ = 2;
    auVar58._24_4_ = 2;
    auVar58._28_4_ = 2;
    auVar53 = vpermps_avx512vl(auVar58,auVar62);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar55 = vpermps_avx512vl(auVar54,auVar62);
    auVar62 = vpermps_avx2(auVar58,auVar63);
    auVar56 = vpermps_avx512vl(auVar54,auVar63);
    auVar63 = vpermps_avx2(auVar58,auVar57);
    auVar57 = vpermps_avx512vl(auVar54,auVar57);
    auVar58 = vpermps_avx512vl(auVar58,auVar59);
    auVar54 = vpermps_avx512vl(auVar54,auVar59);
    auVar29 = vfmadd132ps_fma(auVar64,auVar60,_DAT_02020f20);
    auVar64 = vsubps_avx(auVar115,ZEXT1632(auVar29));
    auVar59 = vmulps_avx512vl(auVar47,ZEXT1632(auVar29));
    auVar65 = ZEXT1632(auVar29);
    auVar60 = vmulps_avx512vl(auVar48,auVar65);
    auVar30 = vfmadd231ps_fma(auVar59,auVar64,auVar66);
    auVar40 = vfmadd231ps_fma(auVar60,auVar64,auVar61);
    auVar59 = vmulps_avx512vl(auVar49,auVar65);
    auVar60 = vmulps_avx512vl(auVar50,auVar65);
    auVar47 = vfmadd231ps_avx512vl(auVar59,auVar64,auVar47);
    auVar59 = vfmadd231ps_avx512vl(auVar60,auVar64,auVar48);
    auVar48 = vmulps_avx512vl(auVar51,auVar65);
    auVar66 = ZEXT1632(auVar29);
    auVar52 = vmulps_avx512vl(auVar52,auVar66);
    auVar60 = vfmadd231ps_avx512vl(auVar48,auVar64,auVar49);
    auVar52 = vfmadd231ps_avx512vl(auVar52,auVar64,auVar50);
    fVar188 = auVar29._0_4_;
    fVar189 = auVar29._4_4_;
    auVar48._4_4_ = fVar189 * auVar47._4_4_;
    auVar48._0_4_ = fVar188 * auVar47._0_4_;
    fVar190 = auVar29._8_4_;
    auVar48._8_4_ = fVar190 * auVar47._8_4_;
    fVar191 = auVar29._12_4_;
    auVar48._12_4_ = fVar191 * auVar47._12_4_;
    auVar48._16_4_ = auVar47._16_4_ * 0.0;
    auVar48._20_4_ = auVar47._20_4_ * 0.0;
    auVar48._24_4_ = auVar47._24_4_ * 0.0;
    auVar48._28_4_ = fVar177;
    auVar49._4_4_ = fVar189 * auVar59._4_4_;
    auVar49._0_4_ = fVar188 * auVar59._0_4_;
    auVar49._8_4_ = fVar190 * auVar59._8_4_;
    auVar49._12_4_ = fVar191 * auVar59._12_4_;
    auVar49._16_4_ = auVar59._16_4_ * 0.0;
    auVar49._20_4_ = auVar59._20_4_ * 0.0;
    auVar49._24_4_ = auVar59._24_4_ * 0.0;
    auVar49._28_4_ = auVar61._28_4_;
    auVar30 = vfmadd231ps_fma(auVar48,auVar64,ZEXT1632(auVar30));
    auVar40 = vfmadd231ps_fma(auVar49,auVar64,ZEXT1632(auVar40));
    auVar65._0_4_ = fVar188 * auVar60._0_4_;
    auVar65._4_4_ = fVar189 * auVar60._4_4_;
    auVar65._8_4_ = fVar190 * auVar60._8_4_;
    auVar65._12_4_ = fVar191 * auVar60._12_4_;
    auVar65._16_4_ = auVar60._16_4_ * 0.0;
    auVar65._20_4_ = auVar60._20_4_ * 0.0;
    auVar65._24_4_ = auVar60._24_4_ * 0.0;
    auVar65._28_4_ = 0;
    auVar50._4_4_ = fVar189 * auVar52._4_4_;
    auVar50._0_4_ = fVar188 * auVar52._0_4_;
    auVar50._8_4_ = fVar190 * auVar52._8_4_;
    auVar50._12_4_ = fVar191 * auVar52._12_4_;
    auVar50._16_4_ = auVar52._16_4_ * 0.0;
    auVar50._20_4_ = auVar52._20_4_ * 0.0;
    auVar50._24_4_ = auVar52._24_4_ * 0.0;
    auVar50._28_4_ = auVar60._28_4_;
    auVar37 = vfmadd231ps_fma(auVar65,auVar64,auVar47);
    auVar33 = vfmadd231ps_fma(auVar50,auVar64,auVar59);
    auVar52._28_4_ = auVar59._28_4_;
    auVar52._0_28_ =
         ZEXT1628(CONCAT412(fVar191 * auVar33._12_4_,
                            CONCAT48(fVar190 * auVar33._8_4_,
                                     CONCAT44(fVar189 * auVar33._4_4_,fVar188 * auVar33._0_4_))));
    auVar32 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar191 * auVar37._12_4_,
                                                 CONCAT48(fVar190 * auVar37._8_4_,
                                                          CONCAT44(fVar189 * auVar37._4_4_,
                                                                   fVar188 * auVar37._0_4_)))),
                              auVar64,ZEXT1632(auVar30));
    auVar34 = vfmadd231ps_fma(auVar52,auVar64,ZEXT1632(auVar40));
    auVar61 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar30));
    auVar47 = vsubps_avx(ZEXT1632(auVar33),ZEXT1632(auVar40));
    auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar61 = vmulps_avx512vl(auVar61,auVar48);
    auVar47 = vmulps_avx512vl(auVar47,auVar48);
    auVar59._0_4_ = fVar193 * auVar61._0_4_;
    auVar59._4_4_ = fVar193 * auVar61._4_4_;
    auVar59._8_4_ = fVar193 * auVar61._8_4_;
    auVar59._12_4_ = fVar193 * auVar61._12_4_;
    auVar59._16_4_ = fVar193 * auVar61._16_4_;
    auVar59._20_4_ = fVar193 * auVar61._20_4_;
    auVar59._24_4_ = fVar193 * auVar61._24_4_;
    auVar59._28_4_ = 0;
    auVar61 = vmulps_avx512vl(auVar67,auVar47);
    auVar37 = vxorps_avx512vl(auVar51._0_16_,auVar51._0_16_);
    auVar47 = vpermt2ps_avx512vl(ZEXT1632(auVar32),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar49 = vpermt2ps_avx512vl(ZEXT1632(auVar34),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar100._0_4_ = auVar59._0_4_ + auVar32._0_4_;
    auVar100._4_4_ = auVar59._4_4_ + auVar32._4_4_;
    auVar100._8_4_ = auVar59._8_4_ + auVar32._8_4_;
    auVar100._12_4_ = auVar59._12_4_ + auVar32._12_4_;
    auVar100._16_4_ = auVar59._16_4_ + 0.0;
    auVar100._20_4_ = auVar59._20_4_ + 0.0;
    auVar100._24_4_ = auVar59._24_4_ + 0.0;
    auVar100._28_4_ = 0;
    auVar60 = ZEXT1632(auVar37);
    auVar50 = vpermt2ps_avx512vl(auVar59,_DAT_0205fd20,auVar60);
    auVar52 = vaddps_avx512vl(ZEXT1632(auVar34),auVar61);
    auVar51 = vpermt2ps_avx512vl(auVar61,_DAT_0205fd20,auVar60);
    auVar61 = vsubps_avx(auVar47,auVar50);
    auVar50 = vsubps_avx512vl(auVar49,auVar51);
    auVar51 = vmulps_avx512vl(auVar62,auVar66);
    auVar59 = vmulps_avx512vl(auVar56,auVar66);
    auVar51 = vfmadd231ps_avx512vl(auVar51,auVar64,auVar53);
    auVar53 = vfmadd231ps_avx512vl(auVar59,auVar64,auVar55);
    auVar55 = vmulps_avx512vl(auVar63,auVar66);
    auVar59 = vmulps_avx512vl(auVar57,auVar66);
    auVar62 = vfmadd231ps_avx512vl(auVar55,auVar64,auVar62);
    auVar55 = vfmadd231ps_avx512vl(auVar59,auVar64,auVar56);
    auVar56 = vmulps_avx512vl(auVar58,auVar66);
    auVar54 = vmulps_avx512vl(auVar54,auVar66);
    auVar30 = vfmadd231ps_fma(auVar56,auVar64,auVar63);
    auVar40 = vfmadd231ps_fma(auVar54,auVar64,auVar57);
    auVar54 = vmulps_avx512vl(auVar66,auVar62);
    auVar56 = vmulps_avx512vl(ZEXT1632(auVar29),auVar55);
    auVar54 = vfmadd231ps_avx512vl(auVar54,auVar64,auVar51);
    auVar56 = vfmadd231ps_avx512vl(auVar56,auVar64,auVar53);
    auVar62 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar191 * auVar30._12_4_,
                                            CONCAT48(fVar190 * auVar30._8_4_,
                                                     CONCAT44(fVar189 * auVar30._4_4_,
                                                              fVar188 * auVar30._0_4_)))),auVar64,
                         auVar62);
    auVar55 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar191 * auVar40._12_4_,
                                            CONCAT48(fVar190 * auVar40._8_4_,
                                                     CONCAT44(fVar189 * auVar40._4_4_,
                                                              fVar188 * auVar40._0_4_)))),auVar64,
                         auVar55);
    auVar51._4_4_ = fVar189 * auVar62._4_4_;
    auVar51._0_4_ = fVar188 * auVar62._0_4_;
    auVar51._8_4_ = fVar190 * auVar62._8_4_;
    auVar51._12_4_ = fVar191 * auVar62._12_4_;
    auVar51._16_4_ = auVar62._16_4_ * 0.0;
    auVar51._20_4_ = auVar62._20_4_ * 0.0;
    auVar51._24_4_ = auVar62._24_4_ * 0.0;
    auVar51._28_4_ = auVar57._28_4_;
    auVar53._4_4_ = fVar189 * auVar55._4_4_;
    auVar53._0_4_ = fVar188 * auVar55._0_4_;
    auVar53._8_4_ = fVar190 * auVar55._8_4_;
    auVar53._12_4_ = fVar191 * auVar55._12_4_;
    auVar53._16_4_ = auVar55._16_4_ * 0.0;
    auVar53._20_4_ = auVar55._20_4_ * 0.0;
    auVar53._24_4_ = auVar55._24_4_ * 0.0;
    auVar53._28_4_ = auVar63._28_4_;
    auVar63 = vfmadd231ps_avx512vl(auVar51,auVar64,auVar54);
    auVar51 = vfmadd231ps_avx512vl(auVar53,auVar56,auVar64);
    auVar64 = vsubps_avx512vl(auVar62,auVar54);
    auVar62 = vsubps_avx512vl(auVar55,auVar56);
    auVar64 = vmulps_avx512vl(auVar64,auVar48);
    auVar62 = vmulps_avx512vl(auVar62,auVar48);
    fVar177 = fVar193 * auVar64._0_4_;
    fVar188 = fVar193 * auVar64._4_4_;
    auVar54._4_4_ = fVar188;
    auVar54._0_4_ = fVar177;
    fVar189 = fVar193 * auVar64._8_4_;
    auVar54._8_4_ = fVar189;
    fVar190 = fVar193 * auVar64._12_4_;
    auVar54._12_4_ = fVar190;
    fVar191 = fVar193 * auVar64._16_4_;
    auVar54._16_4_ = fVar191;
    fVar192 = fVar193 * auVar64._20_4_;
    auVar54._20_4_ = fVar192;
    fVar193 = fVar193 * auVar64._24_4_;
    auVar54._24_4_ = fVar193;
    auVar54._28_4_ = auVar64._28_4_;
    auVar62 = vmulps_avx512vl(auVar67,auVar62);
    auVar48 = vpermt2ps_avx512vl(auVar63,_DAT_0205fd20,auVar60);
    auVar53 = vpermt2ps_avx512vl(auVar51,_DAT_0205fd20,auVar60);
    auVar176._0_4_ = auVar63._0_4_ + fVar177;
    auVar176._4_4_ = auVar63._4_4_ + fVar188;
    auVar176._8_4_ = auVar63._8_4_ + fVar189;
    auVar176._12_4_ = auVar63._12_4_ + fVar190;
    auVar176._16_4_ = auVar63._16_4_ + fVar191;
    auVar176._20_4_ = auVar63._20_4_ + fVar192;
    auVar176._24_4_ = auVar63._24_4_ + fVar193;
    auVar176._28_4_ = auVar63._28_4_ + auVar64._28_4_;
    auVar64 = vpermt2ps_avx512vl(auVar54,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar54 = vaddps_avx512vl(auVar51,auVar62);
    auVar62 = vpermt2ps_avx512vl(auVar62,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar64 = vsubps_avx(auVar48,auVar64);
    auVar62 = vsubps_avx512vl(auVar53,auVar62);
    auVar115 = ZEXT1632(auVar32);
    auVar55 = vsubps_avx512vl(auVar63,auVar115);
    auVar116 = ZEXT1632(auVar34);
    auVar56 = vsubps_avx512vl(auVar51,auVar116);
    auVar57 = vsubps_avx512vl(auVar48,auVar47);
    auVar55 = vaddps_avx512vl(auVar55,auVar57);
    auVar57 = vsubps_avx512vl(auVar53,auVar49);
    auVar56 = vaddps_avx512vl(auVar56,auVar57);
    auVar57 = vmulps_avx512vl(auVar116,auVar55);
    auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar115,auVar56);
    auVar58 = vmulps_avx512vl(auVar52,auVar55);
    auVar58 = vfnmadd231ps_avx512vl(auVar58,auVar100,auVar56);
    auVar59 = vmulps_avx512vl(auVar50,auVar55);
    auVar59 = vfnmadd231ps_avx512vl(auVar59,auVar61,auVar56);
    auVar60 = vmulps_avx512vl(auVar49,auVar55);
    auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar47,auVar56);
    auVar65 = vmulps_avx512vl(auVar51,auVar55);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar63,auVar56);
    auVar66 = vmulps_avx512vl(auVar54,auVar55);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar176,auVar56);
    auVar67 = vmulps_avx512vl(auVar62,auVar55);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar64,auVar56);
    auVar55 = vmulps_avx512vl(auVar53,auVar55);
    auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar48,auVar56);
    auVar56 = vminps_avx512vl(auVar57,auVar58);
    auVar57 = vmaxps_avx512vl(auVar57,auVar58);
    auVar58 = vminps_avx512vl(auVar59,auVar60);
    auVar56 = vminps_avx512vl(auVar56,auVar58);
    auVar58 = vmaxps_avx512vl(auVar59,auVar60);
    auVar57 = vmaxps_avx512vl(auVar57,auVar58);
    auVar58 = vminps_avx512vl(auVar65,auVar66);
    auVar59 = vmaxps_avx512vl(auVar65,auVar66);
    auVar60 = vminps_avx512vl(auVar67,auVar55);
    auVar58 = vminps_avx512vl(auVar58,auVar60);
    auVar56 = vminps_avx512vl(auVar56,auVar58);
    auVar55 = vmaxps_avx512vl(auVar67,auVar55);
    auVar55 = vmaxps_avx512vl(auVar59,auVar55);
    auVar55 = vmaxps_avx512vl(auVar57,auVar55);
    uVar12 = vcmpps_avx512vl(auVar56,local_78,2);
    uVar13 = vcmpps_avx512vl(auVar55,local_98,5);
    uVar26 = 0;
    bVar19 = (byte)uVar12 & (byte)uVar13 & 0x7f;
    if (bVar19 != 0) {
      auVar55 = vsubps_avx512vl(auVar47,auVar115);
      auVar56 = vsubps_avx512vl(auVar49,auVar116);
      auVar57 = vsubps_avx512vl(auVar48,auVar63);
      auVar55 = vaddps_avx512vl(auVar55,auVar57);
      auVar57 = vsubps_avx512vl(auVar53,auVar51);
      auVar56 = vaddps_avx512vl(auVar56,auVar57);
      auVar57 = vmulps_avx512vl(auVar116,auVar55);
      auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar56,auVar115);
      auVar52 = vmulps_avx512vl(auVar52,auVar55);
      auVar52 = vfnmadd213ps_avx512vl(auVar100,auVar56,auVar52);
      auVar50 = vmulps_avx512vl(auVar50,auVar55);
      auVar50 = vfnmadd213ps_avx512vl(auVar61,auVar56,auVar50);
      auVar61 = vmulps_avx512vl(auVar49,auVar55);
      auVar49 = vfnmadd231ps_avx512vl(auVar61,auVar56,auVar47);
      auVar61 = vmulps_avx512vl(auVar51,auVar55);
      auVar51 = vfnmadd231ps_avx512vl(auVar61,auVar56,auVar63);
      auVar61 = vmulps_avx512vl(auVar54,auVar55);
      auVar54 = vfnmadd213ps_avx512vl(auVar176,auVar56,auVar61);
      auVar61 = vmulps_avx512vl(auVar62,auVar55);
      auVar58 = vfnmadd213ps_avx512vl(auVar64,auVar56,auVar61);
      auVar64 = vmulps_avx512vl(auVar53,auVar55);
      auVar53 = vfnmadd231ps_avx512vl(auVar64,auVar48,auVar56);
      auVar61 = vminps_avx(auVar57,auVar52);
      auVar64 = vmaxps_avx(auVar57,auVar52);
      auVar47 = vminps_avx(auVar50,auVar49);
      auVar47 = vminps_avx(auVar61,auVar47);
      auVar61 = vmaxps_avx(auVar50,auVar49);
      auVar64 = vmaxps_avx(auVar64,auVar61);
      auVar63 = vminps_avx(auVar51,auVar54);
      auVar61 = vmaxps_avx(auVar51,auVar54);
      auVar48 = vminps_avx(auVar58,auVar53);
      auVar63 = vminps_avx(auVar63,auVar48);
      auVar63 = vminps_avx(auVar47,auVar63);
      auVar47 = vmaxps_avx(auVar58,auVar53);
      auVar61 = vmaxps_avx(auVar61,auVar47);
      auVar64 = vmaxps_avx(auVar64,auVar61);
      uVar12 = vcmpps_avx512vl(auVar64,local_98,5);
      uVar13 = vcmpps_avx512vl(auVar63,local_78,2);
      uVar26 = (uint)(bVar19 & (byte)uVar12 & (byte)uVar13);
    }
    auVar229 = ZEXT3264(auVar55);
    if (uVar26 != 0) {
      auStack_158[uVar24] = uVar26;
      uVar12 = vmovlps_avx(auVar28);
      *(undefined8 *)(&uStack_b8 + uVar24 * 2) = uVar12;
      uVar21 = vmovlps_avx(local_2e8);
      auStack_58[uVar24] = uVar21;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar230 = ZEXT3264(auVar64);
    auVar231 = ZEXT464(0x3f800000);
    auVar28 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
    in_ZMM16 = ZEXT1664(auVar28);
    auVar235 = ZEXT1664(local_2f8);
    auVar237 = ZEXT1664(local_308);
    do {
      auVar29 = auVar233._0_16_;
      auVar30 = auVar236._0_16_;
      auVar28 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar24 == 0) {
        fVar193 = (ray->super_RayK<1>).tfar;
        auVar18._4_4_ = fVar193;
        auVar18._0_4_ = fVar193;
        auVar18._8_4_ = fVar193;
        auVar18._12_4_ = fVar193;
        uVar12 = vcmpps_avx512vl(local_118,auVar18,2);
        uVar27 = (uint)local_350 & (uint)local_320 & (uint)uVar12;
        local_350 = (ulong)uVar27;
        if (uVar27 == 0) {
          return;
        }
        goto LAB_01b36f10;
      }
      uVar20 = (int)uVar24 - 1;
      uVar22 = (ulong)uVar20;
      uVar26 = (&uStack_b8)[uVar22 * 2];
      fVar193 = afStack_b4[uVar22 * 2];
      uVar5 = auStack_158[uVar22];
      auVar221._8_8_ = 0;
      auVar221._0_8_ = auStack_58[uVar22];
      auVar227 = ZEXT1664(auVar221);
      lVar25 = 0;
      for (uVar21 = (ulong)uVar5; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar23 = uVar5 - 1 & uVar5;
      auStack_158[uVar22] = uVar23;
      if (uVar23 == 0) {
        uVar24 = (ulong)uVar20;
      }
      auVar37 = vpxord_avx512vl(auVar229._0_16_,auVar229._0_16_);
      auVar40 = vcvtsi2ss_avx512f(auVar37,lVar25);
      auVar33 = vmulss_avx512f(auVar40,SUB6416(ZEXT464(0x3e124925),0));
      lVar25 = lVar25 + 1;
      auVar40 = vpxord_avx512vl(auVar37,auVar37);
      auVar40 = vcvtsi2ss_avx512f(auVar40,lVar25);
      auVar40 = vmulss_avx512f(auVar40,SUB6416(ZEXT464(0x3e124925),0));
      auVar32 = auVar231._0_16_;
      auVar37 = vsubss_avx512f(auVar32,auVar33);
      local_338 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * auVar33._0_4_)),ZEXT416(uVar26),auVar37);
      auVar37 = vsubss_avx512f(auVar32,auVar40);
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * auVar40._0_4_)),ZEXT416(uVar26),auVar37);
      fVar177 = auVar40._0_4_;
      fVar188 = local_338._0_4_;
      fVar193 = fVar177 - fVar188;
      vucomiss_avx512f(ZEXT416((uint)fVar193));
      if (uVar5 == 0 || lVar25 == 0) break;
      auVar229 = ZEXT1664(auVar221);
      auVar37 = vshufps_avx(auVar221,auVar221,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar193));
      uVar26 = (uint)uVar24;
      auVar35 = vsubps_avx512vl(auVar29,auVar37);
      fVar189 = auVar37._0_4_;
      auVar110._0_4_ = fVar189 * (float)local_1a8._0_4_;
      fVar190 = auVar37._4_4_;
      auVar110._4_4_ = fVar190 * (float)local_1a8._4_4_;
      fVar191 = auVar37._8_4_;
      auVar110._8_4_ = fVar191 * fStack_1a0;
      fVar192 = auVar37._12_4_;
      auVar110._12_4_ = fVar192 * fStack_19c;
      auVar123._0_4_ = fVar189 * (float)local_1b8._0_4_;
      auVar123._4_4_ = fVar190 * (float)local_1b8._4_4_;
      auVar123._8_4_ = fVar191 * fStack_1b0;
      auVar123._12_4_ = fVar192 * fStack_1ac;
      auVar132._0_4_ = fVar189 * (float)local_1c8._0_4_;
      auVar132._4_4_ = fVar190 * (float)local_1c8._4_4_;
      auVar132._8_4_ = fVar191 * fStack_1c0;
      auVar132._12_4_ = fVar192 * fStack_1bc;
      auVar95._0_4_ = fVar189 * (float)local_1d8._0_4_;
      auVar95._4_4_ = fVar190 * (float)local_1d8._4_4_;
      auVar95._8_4_ = fVar191 * fStack_1d0;
      auVar95._12_4_ = fVar192 * fStack_1cc;
      auVar37 = vfmadd231ps_fma(auVar110,auVar35,local_168);
      auVar33 = vfmadd231ps_fma(auVar123,auVar35,local_178);
      auVar34 = vfmadd231ps_fma(auVar132,auVar35,local_188);
      auVar35 = vfmadd231ps_fma(auVar95,auVar35,local_198);
      auVar57._16_16_ = auVar37;
      auVar57._0_16_ = auVar37;
      auVar116._16_16_ = auVar33;
      auVar116._0_16_ = auVar33;
      auVar126._16_16_ = auVar34;
      auVar126._0_16_ = auVar34;
      auVar146._4_4_ = fVar188;
      auVar146._0_4_ = fVar188;
      auVar146._8_4_ = fVar188;
      auVar146._12_4_ = fVar188;
      auVar146._20_4_ = fVar177;
      auVar146._16_4_ = fVar177;
      auVar146._24_4_ = fVar177;
      auVar146._28_4_ = fVar177;
      auVar64 = vsubps_avx(auVar116,auVar57);
      auVar33 = vfmadd213ps_fma(auVar64,auVar146,auVar57);
      auVar64 = vsubps_avx(auVar126,auVar116);
      auVar36 = vfmadd213ps_fma(auVar64,auVar146,auVar116);
      auVar37 = vsubps_avx(auVar35,auVar34);
      auVar117._16_16_ = auVar37;
      auVar117._0_16_ = auVar37;
      auVar37 = vfmadd213ps_fma(auVar117,auVar146,auVar126);
      auVar64 = vsubps_avx(ZEXT1632(auVar36),ZEXT1632(auVar33));
      auVar33 = vfmadd213ps_fma(auVar64,auVar146,ZEXT1632(auVar33));
      auVar64 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar36));
      auVar37 = vfmadd213ps_fma(auVar64,auVar146,ZEXT1632(auVar36));
      auVar64 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar33));
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar64,auVar146);
      auVar64 = vmulps_avx512vl(auVar64,auVar230._0_32_);
      auVar37 = vmulss_avx512f(ZEXT416((uint)fVar193),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar177 = auVar37._0_4_;
      auVar133._0_8_ =
           CONCAT44(auVar44._4_4_ + fVar177 * auVar64._4_4_,auVar44._0_4_ + fVar177 * auVar64._0_4_)
      ;
      auVar133._8_4_ = auVar44._8_4_ + fVar177 * auVar64._8_4_;
      auVar133._12_4_ = auVar44._12_4_ + fVar177 * auVar64._12_4_;
      auVar111._0_4_ = fVar177 * auVar64._16_4_;
      auVar111._4_4_ = fVar177 * auVar64._20_4_;
      auVar111._8_4_ = fVar177 * auVar64._24_4_;
      auVar111._12_4_ = fVar177 * auVar64._28_4_;
      auVar88 = vsubps_avx((undefined1  [16])0x0,auVar111);
      auVar38 = vshufpd_avx(auVar44,auVar44,3);
      auVar39 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar37 = vsubps_avx(auVar38,auVar44);
      auVar33 = vsubps_avx(auVar39,(undefined1  [16])0x0);
      auVar148._0_4_ = auVar33._0_4_ + auVar37._0_4_;
      auVar148._4_4_ = auVar33._4_4_ + auVar37._4_4_;
      auVar148._8_4_ = auVar33._8_4_ + auVar37._8_4_;
      auVar148._12_4_ = auVar33._12_4_ + auVar37._12_4_;
      auVar37 = vshufps_avx(auVar44,auVar44,0xb1);
      auVar33 = vshufps_avx(auVar133,auVar133,0xb1);
      auVar34 = vshufps_avx(auVar88,auVar88,0xb1);
      auVar35 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar208._4_4_ = auVar148._0_4_;
      auVar208._0_4_ = auVar148._0_4_;
      auVar208._8_4_ = auVar148._0_4_;
      auVar208._12_4_ = auVar148._0_4_;
      auVar36 = vshufps_avx(auVar148,auVar148,0x55);
      fVar177 = auVar36._0_4_;
      auVar163._0_4_ = auVar37._0_4_ * fVar177;
      fVar188 = auVar36._4_4_;
      auVar163._4_4_ = auVar37._4_4_ * fVar188;
      fVar189 = auVar36._8_4_;
      auVar163._8_4_ = auVar37._8_4_ * fVar189;
      fVar190 = auVar36._12_4_;
      auVar163._12_4_ = auVar37._12_4_ * fVar190;
      auVar173._0_4_ = auVar33._0_4_ * fVar177;
      auVar173._4_4_ = auVar33._4_4_ * fVar188;
      auVar173._8_4_ = auVar33._8_4_ * fVar189;
      auVar173._12_4_ = auVar33._12_4_ * fVar190;
      auVar180._0_4_ = auVar34._0_4_ * fVar177;
      auVar180._4_4_ = auVar34._4_4_ * fVar188;
      auVar180._8_4_ = auVar34._8_4_ * fVar189;
      auVar180._12_4_ = auVar34._12_4_ * fVar190;
      auVar149._0_4_ = auVar35._0_4_ * fVar177;
      auVar149._4_4_ = auVar35._4_4_ * fVar188;
      auVar149._8_4_ = auVar35._8_4_ * fVar189;
      auVar149._12_4_ = auVar35._12_4_ * fVar190;
      auVar37 = vfmadd231ps_fma(auVar163,auVar208,auVar44);
      auVar33 = vfmadd231ps_fma(auVar173,auVar208,auVar133);
      auVar36 = vfmadd231ps_fma(auVar180,auVar208,auVar88);
      auVar43 = vfmadd231ps_fma(auVar149,(undefined1  [16])0x0,auVar208);
      auVar31 = vshufpd_avx(auVar37,auVar37,1);
      auVar41 = vshufpd_avx(auVar33,auVar33,1);
      auVar42 = vshufpd_avx(auVar36,auVar36,1);
      auVar46 = vshufpd_avx(auVar43,auVar43,1);
      auVar34 = vminss_avx(auVar37,auVar33);
      auVar37 = vmaxss_avx(auVar33,auVar37);
      auVar35 = vminss_avx(auVar36,auVar43);
      auVar33 = vmaxss_avx(auVar43,auVar36);
      auVar35 = vminss_avx(auVar34,auVar35);
      auVar37 = vmaxss_avx(auVar33,auVar37);
      auVar36 = vminss_avx(auVar31,auVar41);
      auVar33 = vmaxss_avx(auVar41,auVar31);
      auVar31 = vminss_avx(auVar42,auVar46);
      auVar34 = vmaxss_avx(auVar46,auVar42);
      auVar36 = vminss_avx(auVar36,auVar31);
      auVar33 = vmaxss_avx(auVar34,auVar33);
      vucomiss_avx512f(auVar35);
      if ((uVar26 < 5) || (auVar33 = vucomiss_avx512f(auVar28), uVar26 < 5)) {
        auVar37 = vucomiss_avx512f(auVar28);
        uVar12 = vcmpps_avx512vl(auVar36,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar13 = vcmpps_avx512vl(auVar35,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar26 & ((byte)uVar13 | (byte)uVar12)) != 0) goto LAB_01b37d44;
        uVar12 = vcmpps_avx512vl(auVar28,auVar33,5);
        uVar13 = vcmpps_avx512vl(auVar36,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar13 | (ushort)uVar12) & 1) == 0) goto LAB_01b37d44;
LAB_01b3874e:
        bVar10 = true;
        auVar227 = ZEXT1664(auVar221);
      }
      else {
LAB_01b37d44:
        uVar12 = vcmpss_avx512f(auVar35,in_ZMM16._0_16_,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        iVar79 = auVar231._0_4_;
        fVar177 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar79);
        uVar12 = vcmpss_avx512f(auVar37,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar188 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar79);
        auVar64._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar68._4_28_ = auVar64._4_28_;
        auVar68._0_4_ = (uint)(fVar177 == fVar188) * 0x7f800000;
        auVar34 = auVar68._0_16_;
        auVar70._16_16_ = auVar64._16_16_;
        auVar70._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar69._4_28_ = auVar70._4_28_;
        auVar69._0_4_ = (uint)(fVar177 == fVar188) * -0x800000;
        auVar28 = auVar69._0_16_;
        uVar12 = vcmpss_avx512f(auVar36,ZEXT816(0) << 0x20,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar189 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar79);
        auVar31 = ZEXT416(0xbf800000);
        if ((fVar177 != fVar189) || (NAN(fVar177) || NAN(fVar189))) {
          fVar190 = auVar36._0_4_;
          fVar177 = auVar35._0_4_;
          bVar10 = fVar190 == fVar177;
          if ((!bVar10) || (NAN(fVar190) || NAN(fVar177))) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar35 = vxorps_avx512vl(auVar35,auVar17);
            auVar222._0_4_ = auVar35._0_4_ / (fVar190 - fVar177);
            auVar222._4_12_ = auVar35._4_12_;
            auVar35 = vsubss_avx512f(auVar32,auVar222);
            auVar31 = vxorps_avx512vl(auVar31,auVar31);
            auVar36 = vfmadd213ss_avx512f(auVar35,auVar31,auVar222);
            auVar35 = auVar36;
          }
          else {
            auVar31 = vxorps_avx512vl(auVar31,auVar31);
            vucomiss_avx512f(auVar31);
            auVar72._16_16_ = auVar64._16_16_;
            auVar72._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar71._4_28_ = auVar72._4_28_;
            auVar71._0_4_ = (uint)bVar10 * auVar31._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar36 = auVar71._0_16_;
            auVar35 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar34 = vminss_avx(auVar34,auVar36);
          auVar28 = vmaxss_avx(auVar35,auVar28);
        }
        else {
          auVar31 = vxorps_avx512vl(auVar31,auVar31);
        }
        in_ZMM16 = ZEXT1664(auVar31);
        uVar12 = vcmpss_avx512f(auVar33,auVar31,1);
        bVar10 = (bool)((byte)uVar12 & 1);
        fVar177 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar79);
        if ((fVar188 != fVar177) || (NAN(fVar188) || NAN(fVar177))) {
          fVar190 = auVar33._0_4_;
          fVar188 = auVar37._0_4_;
          bVar10 = fVar190 == fVar188;
          if ((!bVar10) || (NAN(fVar190) || NAN(fVar188))) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar37 = vxorps_avx512vl(auVar37,auVar16);
            auVar181._0_4_ = auVar37._0_4_ / (fVar190 - fVar188);
            auVar181._4_12_ = auVar37._4_12_;
            auVar37 = vsubss_avx512f(auVar32,auVar181);
            auVar33 = vfmadd213ss_avx512f(auVar37,auVar31,auVar181);
            auVar37 = auVar33;
          }
          else {
            vucomiss_avx512f(auVar31);
            auVar74._16_16_ = auVar64._16_16_;
            auVar74._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar73._4_28_ = auVar74._4_28_;
            auVar73._0_4_ = (uint)bVar10 * auVar31._0_4_ + (uint)!bVar10 * 0x7f800000;
            auVar33 = auVar73._0_16_;
            auVar37 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar34 = vminss_avx(auVar34,auVar33);
          auVar28 = vmaxss_avx(auVar37,auVar28);
        }
        bVar10 = fVar189 != fVar177;
        auVar37 = vminss_avx512f(auVar34,auVar32);
        auVar76._16_16_ = auVar64._16_16_;
        auVar76._0_16_ = auVar34;
        auVar75._4_28_ = auVar76._4_28_;
        auVar75._0_4_ = (uint)bVar10 * auVar37._0_4_ + (uint)!bVar10 * auVar34._0_4_;
        auVar37 = vmaxss_avx512f(auVar32,auVar28);
        auVar78._16_16_ = auVar64._16_16_;
        auVar78._0_16_ = auVar28;
        auVar77._4_28_ = auVar78._4_28_;
        auVar77._0_4_ = (uint)bVar10 * auVar37._0_4_ + (uint)!bVar10 * auVar28._0_4_;
        auVar28 = vmaxss_avx512f(auVar31,auVar75._0_16_);
        auVar37 = vminss_avx512f(auVar77._0_16_,auVar32);
        bVar10 = true;
        if (auVar37._0_4_ < auVar28._0_4_) goto LAB_01b3874e;
        auVar34 = vmaxss_avx512f(auVar31,ZEXT416((uint)(auVar28._0_4_ + -0.1)));
        auVar41 = vminss_avx512f(ZEXT416((uint)(auVar37._0_4_ + 0.1)),auVar32);
        auVar96._0_8_ = auVar44._0_8_;
        auVar96._8_8_ = auVar96._0_8_;
        auVar174._8_8_ = auVar133._0_8_;
        auVar174._0_8_ = auVar133._0_8_;
        auVar182._8_8_ = auVar88._0_8_;
        auVar182._0_8_ = auVar88._0_8_;
        auVar28 = vshufpd_avx(auVar133,auVar133,3);
        auVar37 = vshufpd_avx(auVar88,auVar88,3);
        auVar33 = vshufps_avx(auVar34,auVar41,0);
        auVar42 = vsubps_avx512vl(auVar29,auVar33);
        fVar177 = auVar33._0_4_;
        auVar219._0_4_ = fVar177 * auVar38._0_4_;
        fVar188 = auVar33._4_4_;
        auVar219._4_4_ = fVar188 * auVar38._4_4_;
        fVar189 = auVar33._8_4_;
        auVar219._8_4_ = fVar189 * auVar38._8_4_;
        fVar190 = auVar33._12_4_;
        auVar219._12_4_ = fVar190 * auVar38._12_4_;
        auVar134._0_4_ = fVar177 * auVar28._0_4_;
        auVar134._4_4_ = fVar188 * auVar28._4_4_;
        auVar134._8_4_ = fVar189 * auVar28._8_4_;
        auVar134._12_4_ = fVar190 * auVar28._12_4_;
        auVar143._0_4_ = fVar177 * auVar37._0_4_;
        auVar143._4_4_ = fVar188 * auVar37._4_4_;
        auVar143._8_4_ = fVar189 * auVar37._8_4_;
        auVar143._12_4_ = fVar190 * auVar37._12_4_;
        auVar112._0_4_ = fVar177 * auVar39._0_4_;
        auVar112._4_4_ = fVar188 * auVar39._4_4_;
        auVar112._8_4_ = fVar189 * auVar39._8_4_;
        auVar112._12_4_ = fVar190 * auVar39._12_4_;
        auVar35 = vfmadd231ps_fma(auVar219,auVar42,auVar96);
        auVar36 = vfmadd231ps_fma(auVar134,auVar42,auVar174);
        auVar31 = vfmadd231ps_fma(auVar143,auVar42,auVar182);
        auVar38 = vfmadd231ps_fma(auVar112,auVar42,ZEXT816(0));
        auVar28 = vsubss_avx512f(auVar32,auVar34);
        auVar37 = vmovshdup_avx512vl(auVar221);
        auVar43 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar37._0_4_ * auVar34._0_4_)),auVar221,
                                      auVar28);
        auVar28 = vsubss_avx512f(auVar32,auVar41);
        auVar44 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar37._0_4_)),auVar221,
                                      auVar28);
        auVar39 = vdivss_avx512f(auVar32,ZEXT416((uint)fVar193));
        auVar28 = vsubps_avx(auVar36,auVar35);
        auVar33 = vmulps_avx512vl(auVar28,auVar30);
        auVar28 = vsubps_avx(auVar31,auVar36);
        auVar34 = vmulps_avx512vl(auVar28,auVar30);
        auVar28 = vsubps_avx(auVar38,auVar31);
        auVar28 = vmulps_avx512vl(auVar28,auVar30);
        auVar37 = vminps_avx(auVar34,auVar28);
        auVar28 = vmaxps_avx(auVar34,auVar28);
        auVar37 = vminps_avx(auVar33,auVar37);
        auVar28 = vmaxps_avx(auVar33,auVar28);
        auVar33 = vshufpd_avx(auVar37,auVar37,3);
        auVar34 = vshufpd_avx(auVar28,auVar28,3);
        auVar37 = vminps_avx(auVar37,auVar33);
        auVar28 = vmaxps_avx(auVar28,auVar34);
        fVar193 = auVar39._0_4_;
        auVar164._0_4_ = fVar193 * auVar37._0_4_;
        auVar164._4_4_ = fVar193 * auVar37._4_4_;
        auVar164._8_4_ = fVar193 * auVar37._8_4_;
        auVar164._12_4_ = fVar193 * auVar37._12_4_;
        auVar150._0_4_ = fVar193 * auVar28._0_4_;
        auVar150._4_4_ = fVar193 * auVar28._4_4_;
        auVar150._8_4_ = fVar193 * auVar28._8_4_;
        auVar150._12_4_ = fVar193 * auVar28._12_4_;
        auVar39 = vdivss_avx512f(auVar32,ZEXT416((uint)(auVar44._0_4_ - auVar43._0_4_)));
        auVar28 = vshufpd_avx(auVar35,auVar35,3);
        auVar37 = vshufpd_avx(auVar36,auVar36,3);
        auVar33 = vshufpd_avx(auVar31,auVar31,3);
        auVar34 = vshufpd_avx(auVar38,auVar38,3);
        auVar28 = vsubps_avx(auVar28,auVar35);
        auVar35 = vsubps_avx(auVar37,auVar36);
        auVar36 = vsubps_avx(auVar33,auVar31);
        auVar34 = vsubps_avx(auVar34,auVar38);
        auVar37 = vminps_avx(auVar28,auVar35);
        auVar28 = vmaxps_avx(auVar28,auVar35);
        auVar33 = vminps_avx(auVar36,auVar34);
        auVar33 = vminps_avx(auVar37,auVar33);
        auVar37 = vmaxps_avx(auVar36,auVar34);
        auVar28 = vmaxps_avx(auVar28,auVar37);
        fVar193 = auVar39._0_4_;
        auVar183._0_4_ = fVar193 * auVar33._0_4_;
        auVar183._4_4_ = fVar193 * auVar33._4_4_;
        auVar183._8_4_ = fVar193 * auVar33._8_4_;
        auVar183._12_4_ = fVar193 * auVar33._12_4_;
        auVar197._0_4_ = fVar193 * auVar28._0_4_;
        auVar197._4_4_ = fVar193 * auVar28._4_4_;
        auVar197._8_4_ = fVar193 * auVar28._8_4_;
        auVar197._12_4_ = fVar193 * auVar28._12_4_;
        auVar229 = ZEXT1664(local_338);
        auVar88 = vinsertps_avx512f(local_338,auVar43,0x10);
        auVar35 = vinsertps_avx(auVar40,auVar44,0x10);
        auVar84._0_4_ = auVar88._0_4_ + auVar35._0_4_;
        auVar84._4_4_ = auVar88._4_4_ + auVar35._4_4_;
        auVar84._8_4_ = auVar88._8_4_ + auVar35._8_4_;
        auVar84._12_4_ = auVar88._12_4_ + auVar35._12_4_;
        auVar15._8_4_ = 0x3f000000;
        auVar15._0_8_ = 0x3f0000003f000000;
        auVar15._12_4_ = 0x3f000000;
        auVar42 = vmulps_avx512vl(auVar84,auVar15);
        auVar33 = vshufps_avx(auVar42,auVar42,0x54);
        uVar81 = auVar42._0_4_;
        auVar103._4_4_ = uVar81;
        auVar103._0_4_ = uVar81;
        auVar103._8_4_ = uVar81;
        auVar103._12_4_ = uVar81;
        auVar36 = vfmadd213ps_avx512vl(auVar235._0_16_,auVar103,auVar234._0_16_);
        auVar37 = vfmadd213ps_fma(auVar237._0_16_,auVar103,local_2c8);
        auVar34 = vfmadd213ps_fma(local_c8,auVar103,local_2d8);
        auVar28 = vsubps_avx(auVar37,auVar36);
        auVar36 = vfmadd213ps_fma(auVar28,auVar103,auVar36);
        auVar28 = vsubps_avx(auVar34,auVar37);
        auVar28 = vfmadd213ps_fma(auVar28,auVar103,auVar37);
        auVar28 = vsubps_avx(auVar28,auVar36);
        auVar37 = vfmadd231ps_fma(auVar36,auVar28,auVar103);
        auVar31 = vmulps_avx512vl(auVar28,auVar30);
        auVar209._8_8_ = auVar37._0_8_;
        auVar209._0_8_ = auVar37._0_8_;
        auVar28 = vshufpd_avx(auVar37,auVar37,3);
        auVar37 = vshufps_avx(auVar42,auVar42,0x55);
        auVar34 = vsubps_avx(auVar28,auVar209);
        auVar36 = vfmadd231ps_fma(auVar209,auVar37,auVar34);
        auVar223._8_8_ = auVar31._0_8_;
        auVar223._0_8_ = auVar31._0_8_;
        auVar28 = vshufpd_avx(auVar31,auVar31,3);
        auVar28 = vsubps_avx(auVar28,auVar223);
        auVar37 = vfmadd213ps_fma(auVar28,auVar37,auVar223);
        auVar104._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
        auVar104._8_4_ = auVar34._8_4_ ^ 0x80000000;
        auVar104._12_4_ = auVar34._12_4_ ^ 0x80000000;
        auVar28 = vmovshdup_avx(auVar37);
        auVar224._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
        auVar224._8_4_ = auVar28._8_4_ ^ 0x80000000;
        auVar224._12_4_ = auVar28._12_4_ ^ 0x80000000;
        auVar31 = vmovshdup_avx512vl(auVar34);
        auVar38 = vpermt2ps_avx512vl(auVar224,ZEXT416(5),auVar34);
        auVar28 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar28._0_4_ * auVar34._0_4_)),auVar37,auVar31
                                     );
        auVar37 = vpermt2ps_avx512vl(auVar37,SUB6416(ZEXT464(4),0),auVar104);
        auVar113._0_4_ = auVar28._0_4_;
        auVar113._4_4_ = auVar113._0_4_;
        auVar113._8_4_ = auVar113._0_4_;
        auVar113._12_4_ = auVar113._0_4_;
        auVar28 = vdivps_avx(auVar38,auVar113);
        auVar37 = vdivps_avx(auVar37,auVar113);
        fVar177 = auVar36._0_4_;
        auVar34 = vshufps_avx(auVar36,auVar36,0x55);
        fVar193 = auVar37._0_4_;
        auVar210._0_4_ = fVar177 * auVar28._0_4_ + auVar34._0_4_ * fVar193;
        auVar210._4_4_ = fVar177 * auVar28._4_4_ + auVar34._4_4_ * auVar37._4_4_;
        auVar210._8_4_ = fVar177 * auVar28._8_4_ + auVar34._8_4_ * auVar37._8_4_;
        auVar210._12_4_ = fVar177 * auVar28._12_4_ + auVar34._12_4_ * auVar37._12_4_;
        auVar46 = vsubps_avx(auVar33,auVar210);
        auVar36 = vmovshdup_avx(auVar28);
        auVar33 = vinsertps_avx(auVar164,auVar183,0x1c);
        auVar225._0_4_ = auVar36._0_4_ * auVar33._0_4_;
        auVar225._4_4_ = auVar36._4_4_ * auVar33._4_4_;
        auVar225._8_4_ = auVar36._8_4_ * auVar33._8_4_;
        auVar225._12_4_ = auVar36._12_4_ * auVar33._12_4_;
        auVar34 = vinsertps_avx(auVar150,auVar197,0x1c);
        auVar211._0_4_ = auVar36._0_4_ * auVar34._0_4_;
        auVar211._4_4_ = auVar36._4_4_ * auVar34._4_4_;
        auVar211._8_4_ = auVar36._8_4_ * auVar34._8_4_;
        auVar211._12_4_ = auVar36._12_4_ * auVar34._12_4_;
        auVar41 = vminps_avx512vl(auVar225,auVar211);
        auVar38 = vmaxps_avx(auVar211,auVar225);
        auVar39 = vmovshdup_avx(auVar37);
        auVar36 = vinsertps_avx(auVar183,auVar164,0x4c);
        auVar184._0_4_ = auVar39._0_4_ * auVar36._0_4_;
        auVar184._4_4_ = auVar39._4_4_ * auVar36._4_4_;
        auVar184._8_4_ = auVar39._8_4_ * auVar36._8_4_;
        auVar184._12_4_ = auVar39._12_4_ * auVar36._12_4_;
        auVar31 = vinsertps_avx(auVar197,auVar150,0x4c);
        auVar198._0_4_ = auVar39._0_4_ * auVar31._0_4_;
        auVar198._4_4_ = auVar39._4_4_ * auVar31._4_4_;
        auVar198._8_4_ = auVar39._8_4_ * auVar31._8_4_;
        auVar198._12_4_ = auVar39._12_4_ * auVar31._12_4_;
        auVar39 = vminps_avx(auVar184,auVar198);
        auVar41 = vaddps_avx512vl(auVar41,auVar39);
        auVar39 = vmaxps_avx(auVar198,auVar184);
        auVar185._0_4_ = auVar38._0_4_ + auVar39._0_4_;
        auVar185._4_4_ = auVar38._4_4_ + auVar39._4_4_;
        auVar185._8_4_ = auVar38._8_4_ + auVar39._8_4_;
        auVar185._12_4_ = auVar38._12_4_ + auVar39._12_4_;
        auVar199._8_8_ = 0x3f80000000000000;
        auVar199._0_8_ = 0x3f80000000000000;
        auVar38 = vsubps_avx(auVar199,auVar185);
        auVar39 = vsubps_avx(auVar199,auVar41);
        auVar41 = vsubps_avx(auVar88,auVar42);
        auVar42 = vsubps_avx(auVar35,auVar42);
        fVar191 = auVar41._0_4_;
        auVar226._0_4_ = fVar191 * auVar38._0_4_;
        fVar192 = auVar41._4_4_;
        auVar226._4_4_ = fVar192 * auVar38._4_4_;
        fVar158 = auVar41._8_4_;
        auVar226._8_4_ = fVar158 * auVar38._8_4_;
        fVar80 = auVar41._12_4_;
        auVar226._12_4_ = fVar80 * auVar38._12_4_;
        auVar45 = vbroadcastss_avx512vl(auVar28);
        auVar33 = vmulps_avx512vl(auVar45,auVar33);
        auVar34 = vmulps_avx512vl(auVar45,auVar34);
        auVar45 = vminps_avx512vl(auVar33,auVar34);
        auVar33 = vmaxps_avx(auVar34,auVar33);
        auVar165._0_4_ = fVar193 * auVar36._0_4_;
        auVar165._4_4_ = fVar193 * auVar36._4_4_;
        auVar165._8_4_ = fVar193 * auVar36._8_4_;
        auVar165._12_4_ = fVar193 * auVar36._12_4_;
        auVar151._0_4_ = fVar193 * auVar31._0_4_;
        auVar151._4_4_ = fVar193 * auVar31._4_4_;
        auVar151._8_4_ = fVar193 * auVar31._8_4_;
        auVar151._12_4_ = fVar193 * auVar31._12_4_;
        auVar34 = vminps_avx(auVar165,auVar151);
        auVar36 = vaddps_avx512vl(auVar45,auVar34);
        auVar31 = vmulps_avx512vl(auVar41,auVar39);
        fVar177 = auVar42._0_4_;
        auVar186._0_4_ = fVar177 * auVar38._0_4_;
        fVar188 = auVar42._4_4_;
        auVar186._4_4_ = fVar188 * auVar38._4_4_;
        fVar189 = auVar42._8_4_;
        auVar186._8_4_ = fVar189 * auVar38._8_4_;
        fVar190 = auVar42._12_4_;
        auVar186._12_4_ = fVar190 * auVar38._12_4_;
        auVar200._0_4_ = fVar177 * auVar39._0_4_;
        auVar200._4_4_ = fVar188 * auVar39._4_4_;
        auVar200._8_4_ = fVar189 * auVar39._8_4_;
        auVar200._12_4_ = fVar190 * auVar39._12_4_;
        auVar34 = vmaxps_avx(auVar151,auVar165);
        auVar152._0_4_ = auVar33._0_4_ + auVar34._0_4_;
        auVar152._4_4_ = auVar33._4_4_ + auVar34._4_4_;
        auVar152._8_4_ = auVar33._8_4_ + auVar34._8_4_;
        auVar152._12_4_ = auVar33._12_4_ + auVar34._12_4_;
        auVar166._8_8_ = 0x3f800000;
        auVar166._0_8_ = 0x3f800000;
        auVar33 = vsubps_avx(auVar166,auVar152);
        auVar34 = vsubps_avx(auVar166,auVar36);
        auVar220._0_4_ = fVar191 * auVar33._0_4_;
        auVar220._4_4_ = fVar192 * auVar33._4_4_;
        auVar220._8_4_ = fVar158 * auVar33._8_4_;
        auVar220._12_4_ = fVar80 * auVar33._12_4_;
        auVar212._0_4_ = fVar191 * auVar34._0_4_;
        auVar212._4_4_ = fVar192 * auVar34._4_4_;
        auVar212._8_4_ = fVar158 * auVar34._8_4_;
        auVar212._12_4_ = fVar80 * auVar34._12_4_;
        auVar153._0_4_ = fVar177 * auVar33._0_4_;
        auVar153._4_4_ = fVar188 * auVar33._4_4_;
        auVar153._8_4_ = fVar189 * auVar33._8_4_;
        auVar153._12_4_ = fVar190 * auVar33._12_4_;
        auVar167._0_4_ = fVar177 * auVar34._0_4_;
        auVar167._4_4_ = fVar188 * auVar34._4_4_;
        auVar167._8_4_ = fVar189 * auVar34._8_4_;
        auVar167._12_4_ = fVar190 * auVar34._12_4_;
        auVar33 = vminps_avx(auVar220,auVar212);
        auVar34 = vminps_avx(auVar153,auVar167);
        auVar36 = vminps_avx(auVar33,auVar34);
        auVar33 = vmaxps_avx(auVar212,auVar220);
        auVar34 = vmaxps_avx(auVar167,auVar153);
        auVar34 = vmaxps_avx(auVar34,auVar33);
        auVar38 = vminps_avx512vl(auVar226,auVar31);
        auVar33 = vminps_avx(auVar186,auVar200);
        auVar33 = vminps_avx(auVar38,auVar33);
        auVar33 = vhaddps_avx(auVar36,auVar33);
        auVar38 = vmaxps_avx512vl(auVar31,auVar226);
        auVar36 = vmaxps_avx(auVar200,auVar186);
        auVar36 = vmaxps_avx(auVar36,auVar38);
        auVar34 = vhaddps_avx(auVar34,auVar36);
        auVar33 = vshufps_avx(auVar33,auVar33,0xe8);
        auVar34 = vshufps_avx(auVar34,auVar34,0xe8);
        auVar154._0_4_ = auVar33._0_4_ + auVar46._0_4_;
        auVar154._4_4_ = auVar33._4_4_ + auVar46._4_4_;
        auVar154._8_4_ = auVar33._8_4_ + auVar46._8_4_;
        auVar154._12_4_ = auVar33._12_4_ + auVar46._12_4_;
        auVar168._0_4_ = auVar34._0_4_ + auVar46._0_4_;
        auVar168._4_4_ = auVar34._4_4_ + auVar46._4_4_;
        auVar168._8_4_ = auVar34._8_4_ + auVar46._8_4_;
        auVar168._12_4_ = auVar34._12_4_ + auVar46._12_4_;
        auVar33 = vmaxps_avx(auVar88,auVar154);
        auVar34 = vminps_avx(auVar168,auVar35);
        uVar21 = vcmpps_avx512vl(auVar34,auVar33,1);
        local_2e8 = vinsertps_avx(auVar43,auVar44,0x10);
        auVar227 = ZEXT1664(local_2e8);
        if ((uVar21 & 3) == 0) {
          vucomiss_avx512f(local_338);
          auVar33 = vxorps_avx512vl(auVar31,auVar31);
          in_ZMM16 = ZEXT1664(auVar33);
          auVar234 = ZEXT1664(local_348);
          if (uVar26 < 4 && (uVar5 == 0 || lVar25 == 0)) {
            bVar10 = false;
          }
          else {
            lVar25 = 200;
            do {
              auVar34 = vsubss_avx512f(auVar32,auVar46);
              fVar189 = auVar34._0_4_;
              fVar177 = fVar189 * fVar189 * fVar189;
              fVar190 = auVar46._0_4_;
              fVar188 = fVar190 * 3.0 * fVar189 * fVar189;
              fVar189 = fVar189 * fVar190 * fVar190 * 3.0;
              auVar135._4_4_ = fVar177;
              auVar135._0_4_ = fVar177;
              auVar135._8_4_ = fVar177;
              auVar135._12_4_ = fVar177;
              auVar124._4_4_ = fVar188;
              auVar124._0_4_ = fVar188;
              auVar124._8_4_ = fVar188;
              auVar124._12_4_ = fVar188;
              auVar97._4_4_ = fVar189;
              auVar97._0_4_ = fVar189;
              auVar97._8_4_ = fVar189;
              auVar97._12_4_ = fVar189;
              fVar190 = fVar190 * fVar190 * fVar190;
              auVar144._0_4_ = (float)local_1e8._0_4_ * fVar190;
              auVar144._4_4_ = (float)local_1e8._4_4_ * fVar190;
              auVar144._8_4_ = fStack_1e0 * fVar190;
              auVar144._12_4_ = fStack_1dc * fVar190;
              auVar34 = vfmadd231ps_fma(auVar144,local_2d8,auVar97);
              auVar34 = vfmadd231ps_fma(auVar34,local_2c8,auVar124);
              auVar34 = vfmadd231ps_avx512vl(auVar34,local_348,auVar135);
              auVar98._8_8_ = auVar34._0_8_;
              auVar98._0_8_ = auVar34._0_8_;
              auVar34 = vshufpd_avx(auVar34,auVar34,3);
              auVar35 = vshufps_avx(auVar46,auVar46,0x55);
              auVar34 = vsubps_avx(auVar34,auVar98);
              auVar35 = vfmadd213ps_fma(auVar34,auVar35,auVar98);
              fVar177 = auVar35._0_4_;
              auVar34 = vshufps_avx(auVar35,auVar35,0x55);
              auVar99._0_4_ = auVar28._0_4_ * fVar177 + fVar193 * auVar34._0_4_;
              auVar99._4_4_ = auVar28._4_4_ * fVar177 + auVar37._4_4_ * auVar34._4_4_;
              auVar99._8_4_ = auVar28._8_4_ * fVar177 + auVar37._8_4_ * auVar34._8_4_;
              auVar99._12_4_ = auVar28._12_4_ * fVar177 + auVar37._12_4_ * auVar34._12_4_;
              auVar46 = vsubps_avx(auVar46,auVar99);
              auVar34 = vandps_avx512vl(auVar35,auVar232._0_16_);
              auVar35 = vprolq_avx512vl(auVar34,0x20);
              auVar34 = vmaxss_avx(auVar35,auVar34);
              bVar11 = auVar34._0_4_ <= (float)local_1f8._0_4_;
              if (auVar34._0_4_ < (float)local_1f8._0_4_) {
                auVar28 = vucomiss_avx512f(auVar33);
                if (bVar11) {
                  auVar37 = vucomiss_avx512f(auVar28);
                  auVar231 = ZEXT1664(auVar37);
                  if (bVar11) {
                    vmovshdup_avx(auVar28);
                    auVar37 = vucomiss_avx512f(auVar33);
                    if (bVar11) {
                      auVar32 = vucomiss_avx512f(auVar37);
                      auVar231 = ZEXT1664(auVar32);
                      if (bVar11) {
                        auVar34 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar42 = vinsertps_avx(auVar34,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar1 = (ray->super_RayK<1>).org.field_0;
                        auVar34 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                        auVar34 = vdpps_avx(auVar34,auVar42,0x7f);
                        auVar35 = vsubps_avx(local_248,(undefined1  [16])aVar1);
                        auVar35 = vdpps_avx(auVar35,auVar42,0x7f);
                        auVar36 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                        auVar36 = vdpps_avx(auVar36,auVar42,0x7f);
                        auVar31 = vsubps_avx(local_228,(undefined1  [16])aVar1);
                        auVar31 = vdpps_avx(auVar31,auVar42,0x7f);
                        auVar38 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
                        auVar38 = vdpps_avx(auVar38,auVar42,0x7f);
                        auVar39 = vsubps_avx(_local_268,(undefined1  [16])aVar1);
                        auVar39 = vdpps_avx(auVar39,auVar42,0x7f);
                        auVar41 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                        auVar41 = vdpps_avx(auVar41,auVar42,0x7f);
                        auVar46 = vsubps_avx(_local_238,(undefined1  [16])aVar1);
                        auVar42 = vdpps_avx(auVar46,auVar42,0x7f);
                        auVar46 = vsubss_avx512f(auVar32,auVar37);
                        fVar193 = auVar37._0_4_;
                        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar193)),auVar46,
                                                  auVar34);
                        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar193)),auVar46,
                                                  auVar35);
                        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * fVar193)),auVar46,
                                                  auVar36);
                        auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar193 * auVar42._0_4_)),auVar46,
                                                  auVar31);
                        auVar32 = vsubss_avx512f(auVar32,auVar28);
                        auVar145._0_4_ = auVar32._0_4_;
                        fVar193 = auVar145._0_4_ * auVar145._0_4_ * auVar145._0_4_;
                        fVar189 = auVar28._0_4_;
                        fVar177 = fVar189 * 3.0 * auVar145._0_4_ * auVar145._0_4_;
                        fVar188 = auVar145._0_4_ * fVar189 * fVar189 * 3.0;
                        fVar191 = fVar189 * fVar189 * fVar189;
                        auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar191 * auVar36._0_4_)),
                                                  ZEXT416((uint)fVar188),auVar35);
                        auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar177),auVar34);
                        auVar37 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar193),auVar37);
                        fVar190 = auVar37._0_4_;
                        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar190) &&
                           (local_354 = (ray->super_RayK<1>).tfar, fVar190 <= local_354)) {
                          auVar37 = vshufps_avx(auVar28,auVar28,0x55);
                          auVar34 = vsubps_avx512vl(auVar29,auVar37);
                          fVar192 = auVar37._0_4_;
                          auVar175._0_4_ = fVar192 * (float)local_218._0_4_;
                          fVar158 = auVar37._4_4_;
                          auVar175._4_4_ = fVar158 * (float)local_218._4_4_;
                          fVar80 = auVar37._8_4_;
                          auVar175._8_4_ = fVar80 * fStack_210;
                          fVar85 = auVar37._12_4_;
                          auVar175._12_4_ = fVar85 * fStack_20c;
                          auVar187._0_4_ = fVar192 * (float)local_268._0_4_;
                          auVar187._4_4_ = fVar158 * (float)local_268._4_4_;
                          auVar187._8_4_ = fVar80 * fStack_260;
                          auVar187._12_4_ = fVar85 * fStack_25c;
                          auVar201._0_4_ = fVar192 * (float)local_278._0_4_;
                          auVar201._4_4_ = fVar158 * (float)local_278._4_4_;
                          auVar201._8_4_ = fVar80 * fStack_270;
                          auVar201._12_4_ = fVar85 * fStack_26c;
                          auVar155._0_4_ = fVar192 * (float)local_238._0_4_;
                          auVar155._4_4_ = fVar158 * (float)local_238._4_4_;
                          auVar155._8_4_ = fVar80 * fStack_230;
                          auVar155._12_4_ = fVar85 * fStack_22c;
                          auVar29 = vfmadd231ps_fma(auVar175,auVar34,local_208);
                          auVar37 = vfmadd231ps_fma(auVar187,auVar34,local_248);
                          auVar32 = vfmadd231ps_fma(auVar201,auVar34,local_258);
                          auVar34 = vfmadd231ps_fma(auVar155,auVar34,local_228);
                          auVar29 = vsubps_avx(auVar37,auVar29);
                          auVar37 = vsubps_avx(auVar32,auVar37);
                          auVar32 = vsubps_avx(auVar34,auVar32);
                          auVar202._0_4_ = fVar189 * auVar37._0_4_;
                          auVar202._4_4_ = fVar189 * auVar37._4_4_;
                          auVar202._8_4_ = fVar189 * auVar37._8_4_;
                          auVar202._12_4_ = fVar189 * auVar37._12_4_;
                          auVar145._4_4_ = auVar145._0_4_;
                          auVar145._8_4_ = auVar145._0_4_;
                          auVar145._12_4_ = auVar145._0_4_;
                          auVar29 = vfmadd231ps_fma(auVar202,auVar145,auVar29);
                          auVar156._0_4_ = fVar189 * auVar32._0_4_;
                          auVar156._4_4_ = fVar189 * auVar32._4_4_;
                          auVar156._8_4_ = fVar189 * auVar32._8_4_;
                          auVar156._12_4_ = fVar189 * auVar32._12_4_;
                          auVar37 = vfmadd231ps_fma(auVar156,auVar145,auVar37);
                          auVar157._0_4_ = fVar189 * auVar37._0_4_;
                          auVar157._4_4_ = fVar189 * auVar37._4_4_;
                          auVar157._8_4_ = fVar189 * auVar37._8_4_;
                          auVar157._12_4_ = fVar189 * auVar37._12_4_;
                          auVar29 = vfmadd231ps_fma(auVar157,auVar145,auVar29);
                          auVar29 = vmulps_avx512vl(auVar29,auVar30);
                          pGVar6 = (context->scene->geometries).items[uVar27].ptr;
                          if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar136._0_4_ = fVar191 * (float)local_108._0_4_;
                            auVar136._4_4_ = fVar191 * (float)local_108._4_4_;
                            auVar136._8_4_ = fVar191 * fStack_100;
                            auVar136._12_4_ = fVar191 * fStack_fc;
                            auVar125._4_4_ = fVar188;
                            auVar125._0_4_ = fVar188;
                            auVar125._8_4_ = fVar188;
                            auVar125._12_4_ = fVar188;
                            auVar30 = vfmadd132ps_fma(auVar125,auVar136,local_f8);
                            auVar114._4_4_ = fVar177;
                            auVar114._0_4_ = fVar177;
                            auVar114._8_4_ = fVar177;
                            auVar114._12_4_ = fVar177;
                            auVar30 = vfmadd132ps_fma(auVar114,auVar30,local_e8);
                            auVar105._4_4_ = fVar193;
                            auVar105._0_4_ = fVar193;
                            auVar105._8_4_ = fVar193;
                            auVar105._12_4_ = fVar193;
                            auVar32 = vfmadd132ps_fma(auVar105,auVar30,local_d8);
                            auVar30 = vshufps_avx(auVar32,auVar32,0xc9);
                            auVar37 = vshufps_avx(auVar29,auVar29,0xc9);
                            auVar106._0_4_ = auVar32._0_4_ * auVar37._0_4_;
                            auVar106._4_4_ = auVar32._4_4_ * auVar37._4_4_;
                            auVar106._8_4_ = auVar32._8_4_ * auVar37._8_4_;
                            auVar106._12_4_ = auVar32._12_4_ * auVar37._12_4_;
                            auVar29 = vfmsub231ps_fma(auVar106,auVar29,auVar30);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar190;
                              auVar30 = vshufps_avx(auVar29,auVar29,0xe9);
                              uVar12 = vmovlps_avx(auVar30);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar12;
                              (ray->Ng).field_0.field_0.z = auVar29._0_4_;
                              uVar12 = vmovlps_avx(auVar28);
                              ray->u = (float)(int)uVar12;
                              ray->v = (float)(int)((ulong)uVar12 >> 0x20);
                              ray->primID = (uint)local_310;
                              ray->geomID = uVar27;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar30 = vshufps_avx(auVar29,auVar29,0xe9);
                              local_148 = vmovlps_avx(auVar30);
                              local_140 = auVar29._0_4_;
                              local_13c = vmovlps_avx(auVar28);
                              local_134 = (uint)local_310;
                              local_130 = uVar27;
                              local_12c = context->user->instID[0];
                              local_128 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar190;
                              local_358 = -1;
                              local_2a8.valid = &local_358;
                              local_2a8.geometryUserPtr = pGVar6->userPtr;
                              local_2a8.context = context->user;
                              local_2a8.ray = (RTCRayN *)ray;
                              local_2a8.hit = (RTCHitN *)&local_148;
                              local_2a8.N = 1;
                              if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b38901:
                                auVar28 = in_ZMM16._0_16_;
                                p_Var9 = context->args->filter;
                                if (p_Var9 != (RTCFilterFunctionN)0x0) {
                                  if (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                     (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                    (*p_Var9)(&local_2a8);
                                    auVar227 = ZEXT1664(local_2e8);
                                    auVar237 = ZEXT1664(local_308);
                                    auVar235 = ZEXT1664(local_2f8);
                                    auVar234 = ZEXT1664(local_348);
                                    auVar28 = vxorps_avx512vl(auVar28,auVar28);
                                    in_ZMM16 = ZEXT1664(auVar28);
                                    auVar231 = ZEXT464(0x3f800000);
                                    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar230 = ZEXT3264(auVar64);
                                    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar236 = ZEXT1664(auVar28);
                                    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar233 = ZEXT1664(auVar28);
                                    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar232 = ZEXT1664(auVar28);
                                  }
                                  if (*local_2a8.valid == 0) goto LAB_01b38a52;
                                }
                                (((Vec3f *)((long)local_2a8.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_2a8.hit;
                                (((Vec3f *)((long)local_2a8.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_2a8.hit + 4);
                                (((Vec3f *)((long)local_2a8.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_2a8.hit + 8);
                                *(float *)((long)local_2a8.ray + 0x3c) =
                                     *(float *)(local_2a8.hit + 0xc);
                                *(float *)((long)local_2a8.ray + 0x40) =
                                     *(float *)(local_2a8.hit + 0x10);
                                *(float *)((long)local_2a8.ray + 0x44) =
                                     *(float *)(local_2a8.hit + 0x14);
                                *(float *)((long)local_2a8.ray + 0x48) =
                                     *(float *)(local_2a8.hit + 0x18);
                                *(float *)((long)local_2a8.ray + 0x4c) =
                                     *(float *)(local_2a8.hit + 0x1c);
                                *(float *)((long)local_2a8.ray + 0x50) =
                                     *(float *)(local_2a8.hit + 0x20);
                              }
                              else {
                                local_2b0 = context;
                                (*pGVar6->intersectionFilterN)(&local_2a8);
                                auVar227 = ZEXT1664(local_2e8);
                                auVar237 = ZEXT1664(local_308);
                                auVar235 = ZEXT1664(local_2f8);
                                auVar234 = ZEXT1664(local_348);
                                auVar28 = vxorps_avx512vl(auVar33,auVar33);
                                in_ZMM16 = ZEXT1664(auVar28);
                                auVar231 = ZEXT464(0x3f800000);
                                auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar230 = ZEXT3264(auVar64);
                                auVar28 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar236 = ZEXT1664(auVar28);
                                auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar233 = ZEXT1664(auVar28);
                                auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar232 = ZEXT1664(auVar28);
                                context = local_2b0;
                                if (*local_2a8.valid != 0) goto LAB_01b38901;
LAB_01b38a52:
                                (ray->super_RayK<1>).tfar = local_354;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar25 = lVar25 + -1;
            } while (lVar25 != 0);
          }
        }
        else {
          auVar28 = vxorps_avx512vl(auVar31,auVar31);
          in_ZMM16 = ZEXT1664(auVar28);
          auVar234 = ZEXT1664(local_348);
        }
      }
    } while (bVar10);
    auVar28 = vinsertps_avx(local_338,auVar40,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }